

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O2

void rgb24_yuv420_sseu(uint32_t width,uint32_t height,uint8_t *RGB,uint32_t RGB_stride,uint8_t *Y,
                      uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte *pbVar1;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar19;
  int iVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  int iVar34;
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  ushort uVar43;
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  ushort uVar90;
  uint8_t uVar91;
  uint8_t uVar92;
  uint8_t uVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  byte bVar132;
  byte bVar133;
  byte bVar134;
  byte bVar135;
  byte bVar136;
  byte bVar137;
  byte bVar138;
  byte bVar139;
  byte bVar140;
  byte bVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [15];
  unkuint9 Var188;
  undefined1 auVar189 [11];
  undefined1 auVar190 [13];
  undefined1 auVar191 [15];
  unkuint9 Var192;
  undefined1 auVar193 [11];
  undefined1 auVar194 [13];
  undefined1 auVar195 [15];
  unkuint9 Var196;
  undefined1 auVar197 [11];
  undefined1 auVar198 [13];
  undefined1 auVar199 [15];
  undefined1 auVar200 [11];
  undefined1 auVar201 [13];
  undefined1 auVar202 [15];
  undefined1 auVar203 [11];
  undefined1 auVar204 [13];
  undefined1 auVar205 [15];
  undefined1 auVar206 [11];
  undefined1 auVar207 [13];
  undefined1 auVar208 [15];
  undefined1 auVar209 [11];
  undefined1 auVar210 [13];
  undefined1 auVar211 [15];
  undefined1 auVar212 [11];
  undefined1 auVar213 [13];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [15];
  undefined1 auVar260 [11];
  undefined1 auVar261 [13];
  undefined1 auVar262 [15];
  undefined1 auVar263 [11];
  undefined1 auVar264 [13];
  undefined1 auVar265 [15];
  undefined1 auVar266 [11];
  undefined1 auVar267 [13];
  undefined1 auVar268 [15];
  undefined1 auVar269 [11];
  undefined1 auVar270 [13];
  undefined1 auVar271 [15];
  undefined1 auVar272 [11];
  undefined1 auVar273 [13];
  undefined1 auVar274 [15];
  undefined1 auVar275 [11];
  undefined1 auVar276 [13];
  undefined1 auVar277 [15];
  undefined1 auVar278 [11];
  undefined1 auVar279 [13];
  undefined1 auVar280 [15];
  undefined1 auVar281 [11];
  undefined1 auVar282 [13];
  undefined3 uVar283;
  undefined3 uVar284;
  undefined3 uVar285;
  undefined1 auVar286 [15];
  undefined1 auVar287 [15];
  undefined8 uVar288;
  undefined1 auVar289 [15];
  undefined1 auVar290 [15];
  undefined1 auVar291 [15];
  undefined1 auVar292 [15];
  undefined1 auVar293 [15];
  undefined1 auVar294 [15];
  undefined1 auVar295 [15];
  undefined1 auVar296 [15];
  undefined8 uVar297;
  undefined1 auVar298 [15];
  undefined1 auVar299 [15];
  undefined1 auVar300 [15];
  undefined1 auVar301 [15];
  undefined1 auVar302 [15];
  undefined1 auVar303 [15];
  undefined1 auVar304 [15];
  undefined1 auVar305 [15];
  undefined1 auVar306 [15];
  undefined1 auVar307 [15];
  undefined1 auVar308 [15];
  undefined1 auVar309 [15];
  undefined1 auVar310 [15];
  undefined1 auVar311 [15];
  undefined1 auVar312 [15];
  undefined1 auVar313 [15];
  undefined1 auVar314 [15];
  undefined1 auVar315 [15];
  undefined1 auVar316 [15];
  undefined1 auVar317 [15];
  undefined1 auVar318 [15];
  undefined1 auVar319 [15];
  uint uVar320;
  uint uVar321;
  uint uVar322;
  undefined5 uVar323;
  undefined5 uVar324;
  undefined5 uVar325;
  undefined1 auVar326 [12];
  undefined1 auVar327 [12];
  undefined8 uVar328;
  undefined1 auVar329 [12];
  undefined8 uVar330;
  undefined1 auVar331 [12];
  undefined1 auVar332 [12];
  undefined1 auVar333 [12];
  undefined1 auVar334 [12];
  undefined1 auVar335 [12];
  undefined1 auVar336 [12];
  undefined1 auVar337 [12];
  undefined1 auVar338 [14];
  undefined1 auVar339 [14];
  undefined8 uVar340;
  undefined1 auVar341 [14];
  undefined8 uVar342;
  undefined1 auVar343 [14];
  undefined1 auVar344 [14];
  undefined1 auVar345 [14];
  undefined1 auVar346 [14];
  undefined1 auVar347 [14];
  undefined1 auVar348 [14];
  undefined1 auVar349 [14];
  ulong uVar350;
  ulong uVar351;
  uint8_t *puVar352;
  long lVar353;
  ulong uVar354;
  uint uVar355;
  uint uVar356;
  ushort uVar357;
  ushort uVar375;
  ushort uVar376;
  ushort uVar379;
  ushort uVar380;
  ushort uVar383;
  ushort uVar384;
  ushort uVar385;
  ushort uVar386;
  undefined1 auVar358 [16];
  ushort uVar387;
  undefined1 auVar365 [16];
  undefined1 auVar388 [16];
  ushort uVar389;
  ushort uVar394;
  ushort uVar395;
  ushort uVar396;
  ushort uVar397;
  ushort uVar399;
  ushort uVar401;
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  short sVar398;
  short sVar400;
  short sVar402;
  ushort uVar403;
  short sVar404;
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar405 [16];
  ushort uVar413;
  short sVar414;
  ushort uVar415;
  short sVar416;
  ushort uVar424;
  short sVar425;
  ushort uVar426;
  ushort uVar427;
  short sVar428;
  ushort uVar429;
  ushort uVar430;
  short sVar431;
  ushort uVar432;
  ushort uVar433;
  short sVar434;
  ushort uVar435;
  ushort uVar436;
  short sVar437;
  ushort uVar438;
  short sVar439;
  ushort uVar440;
  short sVar441;
  ushort uVar442;
  short sVar443;
  undefined1 auVar417 [16];
  ushort uVar444;
  short sVar445;
  ushort uVar446;
  short sVar447;
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  short sVar451;
  short sVar460;
  short sVar461;
  short sVar462;
  short sVar463;
  short sVar464;
  short sVar465;
  short sVar466;
  undefined1 auVar452 [16];
  undefined1 auVar459 [16];
  short sVar468;
  undefined1 auVar467 [16];
  short sVar469;
  short sVar470;
  short sVar471;
  short sVar472;
  short sVar473;
  short sVar474;
  short sVar475;
  ushort uVar476;
  short sVar477;
  ushort uVar478;
  short sVar479;
  short sVar490;
  short sVar491;
  short sVar492;
  short sVar493;
  short sVar494;
  undefined1 auVar480 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  short sVar495;
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  short sVar505;
  short sVar517;
  short sVar518;
  short sVar519;
  short sVar520;
  short sVar521;
  short sVar522;
  undefined1 auVar506 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  short sVar523;
  short sVar525;
  undefined1 auVar524 [16];
  undefined1 auVar526 [16];
  undefined1 auVar534 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar551 [16];
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar20;
  undefined1 auVar366 [16];
  undefined1 auVar359 [16];
  undefined1 auVar367 [16];
  undefined1 auVar360 [16];
  undefined1 auVar368 [16];
  undefined1 auVar361 [16];
  undefined1 auVar369 [16];
  undefined1 auVar362 [16];
  undefined1 auVar370 [16];
  undefined1 auVar363 [16];
  undefined1 auVar371 [16];
  undefined1 auVar364 [16];
  undefined1 auVar372 [16];
  byte bVar373;
  byte bVar374;
  byte bVar377;
  byte bVar378;
  byte bVar381;
  byte bVar382;
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar527 [16];
  undefined1 auVar535 [16];
  undefined1 auVar528 [16];
  undefined1 auVar536 [16];
  undefined1 auVar529 [16];
  undefined1 auVar537 [16];
  undefined1 auVar530 [16];
  undefined1 auVar538 [16];
  undefined1 auVar531 [16];
  undefined1 auVar539 [16];
  undefined1 auVar532 [16];
  undefined1 auVar540 [16];
  undefined1 auVar533 [16];
  undefined1 auVar541 [16];
  undefined1 auVar544 [16];
  undefined1 auVar552 [16];
  undefined1 auVar545 [16];
  undefined1 auVar553 [16];
  undefined1 auVar546 [16];
  undefined1 auVar554 [16];
  undefined1 auVar547 [16];
  undefined1 auVar555 [16];
  undefined1 auVar548 [16];
  undefined1 auVar556 [16];
  undefined1 auVar549 [16];
  undefined1 auVar557 [16];
  undefined1 auVar550 [16];
  undefined1 auVar558 [16];
  
  uVar350 = (ulong)yuv_type;
  iVar34 = Y_stride * 2;
  iVar21 = RGB_stride * 2;
  uVar356 = 0;
  uVar354 = 0;
  for (uVar355 = 0; uVar355 < height - 1; uVar355 = uVar355 + 2) {
    uVar351 = (ulong)((uVar355 >> 1) * UV_stride);
    puVar352 = RGB;
    for (lVar353 = 0; (uint)lVar353 < width - 0x1f; lVar353 = lVar353 + 0x20) {
      auVar516 = *(undefined1 (*) [16])(puVar352 + uVar356);
      auVar391 = *(undefined1 (*) [16])(puVar352 + (ulong)uVar356 + 0x10);
      puVar2 = puVar352 + (ulong)uVar356 + 0x20;
      uVar91 = puVar2[0xb];
      uVar92 = puVar2[0xd];
      uVar93 = puVar2[0xf];
      pbVar1 = puVar352 + RGB_stride;
      bVar94 = *pbVar1;
      bVar20 = pbVar1[1];
      bVar19 = pbVar1[2];
      bVar10 = pbVar1[3];
      bVar95 = pbVar1[4];
      bVar96 = pbVar1[5];
      bVar97 = pbVar1[6];
      bVar98 = pbVar1[7];
      bVar99 = pbVar1[8];
      bVar100 = pbVar1[9];
      bVar101 = pbVar1[10];
      bVar102 = pbVar1[0xb];
      bVar103 = pbVar1[0xc];
      bVar104 = pbVar1[0xd];
      bVar105 = pbVar1[0xe];
      bVar106 = pbVar1[0xf];
      pbVar1 = puVar352 + (ulong)RGB_stride + 0x10;
      bVar107 = *pbVar1;
      bVar108 = pbVar1[1];
      bVar109 = pbVar1[2];
      bVar11 = pbVar1[3];
      bVar110 = pbVar1[4];
      bVar111 = pbVar1[5];
      bVar112 = pbVar1[6];
      bVar113 = pbVar1[7];
      bVar114 = pbVar1[8];
      bVar12 = pbVar1[9];
      bVar115 = pbVar1[10];
      bVar116 = pbVar1[0xb];
      bVar117 = pbVar1[0xc];
      bVar118 = pbVar1[0xd];
      bVar119 = pbVar1[0xe];
      bVar120 = pbVar1[0xf];
      pbVar1 = puVar352 + (ulong)RGB_stride + 0x20;
      bVar121 = *pbVar1;
      bVar122 = pbVar1[2];
      bVar123 = pbVar1[3];
      bVar124 = pbVar1[6];
      bVar125 = pbVar1[7];
      bVar126 = pbVar1[9];
      bVar127 = pbVar1[0xc];
      bVar128 = pbVar1[0xd];
      bVar129 = pbVar1[0xf];
      auVar364._0_14_ = auVar516._0_14_;
      auVar364[0xe] = auVar516[7];
      auVar364[0xf] = bVar98;
      auVar363._14_2_ = auVar364._14_2_;
      auVar363._0_13_ = auVar516._0_13_;
      auVar363[0xd] = bVar97;
      auVar362._13_3_ = auVar363._13_3_;
      auVar362._0_12_ = auVar516._0_12_;
      auVar362[0xc] = auVar516[6];
      auVar361._12_4_ = auVar362._12_4_;
      auVar361._0_11_ = auVar516._0_11_;
      auVar361[0xb] = bVar96;
      bVar381 = auVar516[5];
      auVar360._11_5_ = auVar361._11_5_;
      auVar360._0_10_ = auVar516._0_10_;
      auVar360[10] = bVar381;
      auVar359._10_6_ = auVar360._10_6_;
      auVar359._0_9_ = auVar516._0_9_;
      auVar359[9] = bVar95;
      auVar358._9_7_ = auVar359._9_7_;
      auVar358._0_8_ = auVar516._0_8_;
      auVar358[8] = auVar516[4];
      auVar146._1_8_ = auVar358._8_8_;
      auVar146[0] = bVar10;
      bVar377 = auVar516[3];
      auVar146._9_7_ = 0;
      auVar145._10_6_ = 0;
      auVar145._0_10_ = SUB1610(auVar146 << 0x38,6);
      bVar373 = auVar516[2];
      auVar144._11_5_ = 0;
      auVar144._0_11_ = SUB1611(auVar145 << 0x30,5);
      auVar143._12_4_ = 0;
      auVar143._0_12_ = SUB1612(auVar144 << 0x28,4);
      auVar142._13_3_ = 0;
      auVar142._0_13_ = SUB1613(auVar143 << 0x20,3);
      auVar390._14_2_ = 0;
      auVar390._0_14_ = SUB1614(auVar142 << 0x18,2);
      auVar390 = auVar390 << 0x10;
      auVar423._0_14_ = auVar391._0_14_;
      auVar423[0xe] = auVar391[7];
      auVar423[0xf] = bVar113;
      auVar422._14_2_ = auVar423._14_2_;
      auVar422._0_13_ = auVar391._0_13_;
      auVar422[0xd] = bVar112;
      auVar421._13_3_ = auVar422._13_3_;
      auVar421._0_12_ = auVar391._0_12_;
      auVar421[0xc] = auVar391[6];
      auVar420._12_4_ = auVar421._12_4_;
      auVar420._0_11_ = auVar391._0_11_;
      auVar420[0xb] = bVar111;
      auVar419._11_5_ = auVar420._11_5_;
      auVar419._0_10_ = auVar391._0_10_;
      auVar419[10] = auVar391[5];
      auVar418._10_6_ = auVar419._10_6_;
      auVar418._0_9_ = auVar391._0_9_;
      auVar418[9] = bVar110;
      auVar417._9_7_ = auVar418._9_7_;
      auVar417._0_8_ = auVar391._0_8_;
      auVar417[8] = auVar391[4];
      auVar151._1_8_ = auVar417._8_8_;
      auVar151[0] = bVar11;
      auVar151._9_7_ = 0;
      auVar150._10_6_ = 0;
      auVar150._0_10_ = SUB1610(auVar151 << 0x38,6);
      auVar149._11_5_ = 0;
      auVar149._0_11_ = SUB1611(auVar150 << 0x30,5);
      auVar148._12_4_ = 0;
      auVar148._0_12_ = SUB1612(auVar149 << 0x28,4);
      auVar147._13_3_ = 0;
      auVar147._0_13_ = SUB1613(auVar148 << 0x20,3);
      auVar448._0_14_ = SUB1614(auVar147 << 0x18,2) << 0x10;
      auVar487._0_14_ = auVar390._0_14_;
      auVar487[0xe] = bVar10;
      auVar487[0xf] = bVar116;
      auVar486._14_2_ = auVar487._14_2_;
      auVar486._0_13_ = auVar390._0_13_;
      auVar486[0xd] = auVar391[0xb];
      auVar485._13_3_ = auVar486._13_3_;
      auVar485._0_12_ = auVar390._0_12_;
      auVar485[0xc] = bVar377;
      auVar484._12_4_ = auVar485._12_4_;
      auVar484._0_11_ = auVar390._0_11_;
      auVar484[0xb] = bVar115;
      auVar483._11_5_ = auVar484._11_5_;
      auVar483._0_10_ = auVar390._0_10_;
      auVar483[10] = bVar19;
      auVar482._10_6_ = auVar483._10_6_;
      auVar482._0_9_ = auVar390._0_9_;
      auVar482[9] = auVar391[10];
      auVar481._9_7_ = auVar482._9_7_;
      auVar481._0_8_ = auVar390._0_8_;
      auVar481[8] = bVar373;
      auVar156._1_8_ = auVar481._8_8_;
      auVar156[0] = bVar12;
      auVar156._9_7_ = 0;
      auVar155._10_6_ = 0;
      auVar155._0_10_ = SUB1610(auVar156 << 0x38,6);
      auVar154._11_5_ = 0;
      auVar154._0_11_ = SUB1611(auVar155 << 0x30,5);
      auVar153._12_4_ = 0;
      auVar153._0_12_ = SUB1612(auVar154 << 0x28,4);
      auVar152._13_3_ = 0;
      auVar152._0_13_ = SUB1613(auVar153 << 0x20,3);
      auVar480._14_2_ = 0;
      auVar480._0_14_ = SUB1614(auVar152 << 0x18,2);
      auVar480 = auVar480 << 0x10;
      auVar161._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar123,bVar102),
                                                                        puVar2[3]),auVar516[0xb]),
                                                      bVar122),bVar101),puVar2[2]),
                           CONCAT11(auVar516[10],bVar102)) >> 8);
      auVar161[0] = pbVar1[1];
      auVar161._9_7_ = 0;
      auVar160._10_6_ = 0;
      auVar160._0_10_ = SUB1610(auVar161 << 0x38,6);
      auVar159._11_5_ = 0;
      auVar159._0_11_ = SUB1611(auVar160 << 0x30,5);
      auVar158._12_4_ = 0;
      auVar158._0_12_ = SUB1612(auVar159 << 0x28,4);
      auVar157._13_3_ = 0;
      auVar157._0_13_ = SUB1613(auVar158 << 0x20,3);
      auVar388._0_14_ = SUB1614(auVar157 << 0x18,2) << 0x10;
      auVar448[0xe] = bVar11;
      auVar448[0xf] = pbVar1[0xb];
      auVar533._0_14_ = auVar480._0_14_;
      auVar533[0xe] = bVar12;
      auVar533[0xf] = pbVar1[5];
      auVar532._14_2_ = auVar533._14_2_;
      auVar532._0_13_ = auVar480._0_13_;
      auVar532[0xd] = bVar104;
      auVar531._13_3_ = auVar532._13_3_;
      auVar531._0_12_ = auVar480._0_12_;
      auVar531[0xc] = bVar20;
      auVar530._12_4_ = auVar531._12_4_;
      auVar530._0_11_ = auVar480._0_11_;
      auVar530[0xb] = puVar2[5];
      auVar529._11_5_ = auVar530._11_5_;
      auVar529._0_10_ = auVar480._0_10_;
      auVar529[10] = auVar391[9];
      auVar528._10_6_ = auVar529._10_6_;
      auVar528._0_9_ = auVar480._0_9_;
      auVar528[9] = auVar516[0xd];
      auVar527._9_7_ = auVar528._9_7_;
      auVar527._0_8_ = auVar480._0_8_;
      auVar527[8] = auVar516[1];
      auVar166._1_8_ = auVar527._8_8_;
      auVar166[0] = pbVar1[4];
      auVar166._9_7_ = 0;
      auVar165._10_6_ = 0;
      auVar165._0_10_ = SUB1610(auVar166 << 0x38,6);
      auVar164._11_5_ = 0;
      auVar164._0_11_ = SUB1611(auVar165 << 0x30,5);
      auVar163._12_4_ = 0;
      auVar163._0_12_ = SUB1612(auVar164 << 0x28,4);
      auVar162._13_3_ = 0;
      auVar162._0_13_ = SUB1613(auVar163 << 0x20,3);
      auVar526._14_2_ = 0;
      auVar526._0_14_ = SUB1614(auVar162 << 0x18,2);
      auVar526 = auVar526 << 0x10;
      auVar171._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar126,bVar118),
                                                                        bVar108),bVar96),puVar2[9]),
                                             auVar391[0xd]),auVar391[1]),CONCAT11(bVar381,bVar118))
                 >> 8);
      auVar171[0] = pbVar1[8];
      auVar171._9_7_ = 0;
      auVar170._10_6_ = 0;
      auVar170._0_10_ = SUB1610(auVar171 << 0x38,6);
      auVar169._11_5_ = 0;
      auVar169._0_11_ = SUB1611(auVar170 << 0x30,5);
      auVar168._12_4_ = 0;
      auVar168._0_12_ = SUB1612(auVar169 << 0x28,4);
      auVar167._13_3_ = 0;
      auVar167._0_13_ = SUB1613(auVar168 << 0x20,3);
      auVar496._14_2_ = 0;
      auVar496._0_14_ = SUB1614(auVar167 << 0x18,2);
      auVar496 = auVar496 << 0x10;
      auVar388[0xe] = pbVar1[1];
      auVar388[0xf] = bVar128;
      auVar513._0_14_ = auVar526._0_14_;
      auVar513[0xe] = pbVar1[4];
      auVar513[0xf] = pbVar1[10];
      auVar512._14_2_ = auVar513._14_2_;
      auVar512._0_13_ = auVar526._0_13_;
      auVar512[0xd] = bVar119;
      auVar511._13_3_ = auVar512._13_3_;
      auVar511._0_12_ = auVar526._0_12_;
      auVar511[0xc] = bVar114;
      auVar510._12_4_ = auVar511._12_4_;
      auVar510._0_11_ = auVar526._0_11_;
      auVar510[0xb] = bVar109;
      auVar509._11_5_ = auVar510._11_5_;
      auVar509._0_10_ = auVar526._0_10_;
      auVar509[10] = bVar103;
      auVar508._10_6_ = auVar509._10_6_;
      auVar508._0_9_ = auVar526._0_9_;
      auVar508[9] = bVar97;
      auVar507._9_7_ = auVar508._9_7_;
      auVar507._0_8_ = auVar526._0_8_;
      auVar507[8] = bVar94;
      auVar176._1_8_ = auVar507._8_8_;
      auVar176[0] = puVar2[10];
      auVar176._9_7_ = 0;
      auVar175._10_6_ = 0;
      auVar175._0_10_ = SUB1610(auVar176 << 0x38,6);
      auVar174._11_5_ = 0;
      auVar174._0_11_ = SUB1611(auVar175 << 0x30,5);
      auVar173._12_4_ = 0;
      auVar173._0_12_ = SUB1612(auVar174 << 0x28,4);
      auVar172._13_3_ = 0;
      auVar172._0_13_ = SUB1613(auVar173 << 0x20,3);
      auVar506._14_2_ = 0;
      auVar506._0_14_ = SUB1614(auVar172 << 0x18,2);
      auVar506 = auVar506 << 0x10;
      uVar283 = CONCAT12(bVar98,CONCAT11(bVar20,uVar91));
      uVar320 = CONCAT13(bVar104,uVar283);
      uVar323 = CONCAT14(bVar11,uVar320);
      auVar338[5] = bVar12;
      auVar338._0_5_ = uVar323;
      auVar181._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar127,bVar124),
                                                                        bVar121),bVar115),bVar110),
                                             bVar105),bVar99),CONCAT11(bVar19,bVar124)) >> 8);
      auVar181[0] = puVar2[0xc];
      auVar181._9_7_ = 0;
      auVar180._10_6_ = 0;
      auVar180._0_10_ = SUB1610(auVar181 << 0x38,6);
      auVar179._11_5_ = 0;
      auVar179._0_11_ = SUB1611(auVar180 << 0x30,5);
      auVar178._12_4_ = 0;
      auVar178._0_12_ = SUB1612(auVar179 << 0x28,4);
      auVar177._13_3_ = 0;
      auVar177._0_13_ = SUB1613(auVar178 << 0x20,3);
      auVar542._14_2_ = 0;
      auVar542._0_14_ = SUB1614(auVar177 << 0x18,2);
      auVar542 = auVar542 << 0x10;
      uVar284 = CONCAT12(bVar100,CONCAT11(bVar10,uVar92));
      uVar321 = CONCAT13(bVar106,uVar284);
      uVar324 = CONCAT14(bVar111,uVar321);
      auVar339[5] = bVar116;
      auVar339._0_5_ = uVar324;
      auVar550._0_14_ = auVar496._0_14_;
      auVar550[0xe] = pbVar1[8];
      auVar550[0xf] = pbVar1[0xe];
      auVar549._14_2_ = auVar550._14_2_;
      auVar549._0_13_ = auVar496._0_13_;
      auVar549[0xd] = bVar122;
      auVar548._13_3_ = auVar549._13_3_;
      auVar548._0_12_ = auVar496._0_12_;
      auVar548[0xc] = bVar117;
      auVar547._12_4_ = auVar548._12_4_;
      auVar547._0_11_ = auVar496._0_11_;
      auVar547[0xb] = bVar112;
      auVar546._11_5_ = auVar547._11_5_;
      auVar546._0_10_ = auVar496._0_10_;
      auVar546[10] = bVar107;
      auVar545._10_6_ = auVar546._10_6_;
      auVar545._0_9_ = auVar496._0_9_;
      auVar545[9] = bVar101;
      auVar544._9_7_ = auVar545._9_7_;
      auVar544._0_8_ = auVar496._0_8_;
      auVar544[8] = bVar95;
      auVar186._1_8_ = auVar544._8_8_;
      auVar186[0] = puVar2[0xe];
      auVar186._9_7_ = 0;
      auVar185._10_6_ = 0;
      auVar185._0_10_ = SUB1610(auVar186 << 0x38,6);
      auVar184._11_5_ = 0;
      auVar184._0_11_ = SUB1611(auVar185 << 0x30,5);
      auVar183._12_4_ = 0;
      auVar183._0_12_ = SUB1612(auVar184 << 0x28,4);
      auVar182._13_3_ = 0;
      auVar182._0_13_ = SUB1613(auVar183 << 0x20,3);
      auVar543._14_2_ = 0;
      auVar543._0_14_ = SUB1614(auVar182 << 0x18,2);
      auVar543 = auVar543 << 0x10;
      uVar285 = CONCAT12(bVar102,CONCAT11(bVar96,uVar93));
      uVar322 = CONCAT13(bVar108,uVar285);
      uVar325 = CONCAT14(bVar113,uVar322);
      auVar341[5] = bVar118;
      auVar341._0_5_ = uVar325;
      auVar35[0xd] = 0;
      auVar35._0_13_ = auVar506._0_13_;
      auVar35[0xe] = puVar2[10];
      uVar43 = auVar35._13_2_;
      auVar44[0xc] = puVar2[4];
      auVar44._0_12_ = auVar506._0_12_;
      auVar44._13_2_ = uVar43;
      auVar58[0xb] = 0;
      auVar58._0_11_ = auVar506._0_11_;
      auVar58._12_3_ = auVar44._12_3_;
      auVar66[10] = auVar391[0xe];
      auVar66._0_10_ = auVar506._0_10_;
      auVar66._11_4_ = auVar58._11_4_;
      auVar80[9] = 0;
      auVar80._0_9_ = auVar506._0_9_;
      auVar80._10_5_ = auVar66._10_5_;
      auVar88[8] = auVar391[8];
      auVar88._0_8_ = auVar506._0_8_;
      auVar88._9_6_ = auVar80._9_6_;
      auVar187._7_8_ = 0;
      auVar187._0_7_ = auVar88._8_7_;
      Var188 = CONCAT81(SUB158(auVar187 << 0x40,7),auVar391[2]);
      auVar286._9_6_ = 0;
      auVar286._0_9_ = Var188;
      auVar189._1_10_ = SUB1510(auVar286 << 0x30,5);
      auVar189[0] = auVar516[0xc];
      auVar287._11_4_ = 0;
      auVar287._0_11_ = auVar189;
      auVar190._1_12_ = SUB1512(auVar287 << 0x20,3);
      auVar190[0] = auVar516[6];
      auVar338._6_8_ = 0;
      auVar22[0xe] = uVar91;
      auVar22._0_14_ = auVar338 << 0x38;
      uVar328 = CONCAT26(auVar22._13_2_,CONCAT15(puVar2[5],uVar323));
      auVar326._4_8_ = 0;
      auVar326._0_4_ = uVar320;
      auVar45._12_3_ = (int3)((ulong)uVar328 >> 0x28);
      auVar45._0_12_ = auVar326 << 0x38;
      uVar297 = CONCAT44(auVar45._11_4_,CONCAT13(auVar391[0xf],uVar283));
      auVar67._10_5_ = (int5)((ulong)uVar297 >> 0x18);
      auVar67._0_10_ = (unkuint10)CONCAT11(bVar20,uVar91) << 0x38;
      uVar288 = CONCAT62(auVar67._9_6_,CONCAT11(auVar391[9],uVar91));
      auVar191._7_8_ = 0;
      auVar191._0_7_ = (uint7)((ulong)uVar288 >> 8);
      Var192 = CONCAT81(SUB158(auVar191 << 0x40,7),auVar391[3]);
      auVar289._9_6_ = 0;
      auVar289._0_9_ = Var192;
      auVar193._1_10_ = SUB1510(auVar289 << 0x30,5);
      auVar193[0] = auVar516[0xd];
      auVar290._11_4_ = 0;
      auVar290._0_11_ = auVar193;
      auVar194._1_12_ = SUB1512(auVar290 << 0x20,3);
      auVar194[0] = auVar516[7];
      auVar23[0xd] = 0;
      auVar23._0_13_ = auVar542._0_13_;
      auVar23[0xe] = puVar2[0xc];
      uVar376 = auVar23._13_2_;
      auVar36[0xc] = puVar2[6];
      auVar36._0_12_ = auVar542._0_12_;
      auVar36._13_2_ = uVar376;
      auVar46[0xb] = 0;
      auVar46._0_11_ = auVar542._0_11_;
      auVar46._12_3_ = auVar36._12_3_;
      auVar59[10] = *puVar2;
      auVar59._0_10_ = auVar542._0_10_;
      auVar59._11_4_ = auVar46._11_4_;
      auVar68[9] = 0;
      auVar68._0_9_ = auVar542._0_9_;
      auVar68._10_5_ = auVar59._10_5_;
      auVar81[8] = auVar391[10];
      auVar81._0_8_ = auVar542._0_8_;
      auVar81._9_6_ = auVar68._9_6_;
      auVar195._7_8_ = 0;
      auVar195._0_7_ = auVar81._8_7_;
      Var196 = CONCAT81(SUB158(auVar195 << 0x40,7),auVar391[4]);
      auVar291._9_6_ = 0;
      auVar291._0_9_ = Var196;
      auVar197._1_10_ = SUB1510(auVar291 << 0x30,5);
      auVar197[0] = auVar516[0xe];
      auVar292._11_4_ = 0;
      auVar292._0_11_ = auVar197;
      auVar198._1_12_ = SUB1512(auVar292 << 0x20,3);
      auVar198[0] = auVar516[8];
      auVar390 = pshuflw(ZEXT116(RGB2YUV[uVar350].r_factor),ZEXT116(RGB2YUV[uVar350].r_factor),0);
      sVar471 = auVar390._0_2_;
      sVar473 = auVar390._2_2_;
      sVar521 = (short)Var188;
      auVar390 = pshuflw(ZEXT116(RGB2YUV[uVar350].g_factor),ZEXT116(RGB2YUV[uVar350].g_factor),0);
      sVar474 = auVar390._0_2_;
      sVar475 = auVar390._2_2_;
      auVar390 = pshuflw(ZEXT116(RGB2YUV[uVar350].b_factor),ZEXT116(RGB2YUV[uVar350].b_factor),0);
      sVar470 = auVar390._0_2_;
      sVar472 = auVar390._2_2_;
      sVar398 = (short)Var196;
      uVar413 = (ushort)(sVar470 * (ushort)bVar373 +
                        (ushort)auVar516[1] * sVar474 + sVar471 * (ushort)auVar516[0]) >> 8;
      uVar424 = (ushort)(sVar472 * auVar198._0_2_ +
                        auVar194._0_2_ * sVar475 + sVar473 * auVar190._0_2_) >> 8;
      uVar427 = (ushort)(sVar470 * auVar197._0_2_ +
                        auVar193._0_2_ * sVar474 + sVar471 * auVar189._0_2_) >> 8;
      uVar430 = (ushort)(sVar472 * sVar398 + (short)Var192 * sVar475 + sVar473 * sVar521) >> 8;
      uVar433 = (ushort)(sVar470 * auVar81._8_2_ +
                        (short)((ulong)uVar288 >> 8) * sVar474 + sVar471 * auVar88._8_2_) >> 8;
      uVar436 = (ushort)(sVar472 * auVar59._10_2_ +
                        (short)((ulong)uVar297 >> 0x18) * sVar475 + sVar473 * auVar66._10_2_) >> 8;
      uVar440 = (ushort)(sVar470 * auVar36._12_2_ +
                        (short)((ulong)uVar328 >> 0x28) * sVar474 + sVar471 * auVar44._12_2_) >> 8;
      uVar444 = (ushort)(sVar472 * (uVar376 >> 8) +
                        (auVar22._13_2_ >> 8) * sVar475 + sVar473 * (uVar43 >> 8)) >> 8;
      auVar339._6_8_ = 0;
      auVar24[0xe] = uVar92;
      auVar24._0_14_ = auVar339 << 0x38;
      uVar340 = CONCAT26(auVar24._13_2_,CONCAT15(puVar2[7],uVar324));
      auVar327._4_8_ = 0;
      auVar327._0_4_ = uVar321;
      auVar47._12_3_ = (int3)((ulong)uVar340 >> 0x28);
      auVar47._0_12_ = auVar327 << 0x38;
      uVar328 = CONCAT44(auVar47._11_4_,CONCAT13(puVar2[1],uVar284));
      auVar69._10_5_ = (int5)((ulong)uVar328 >> 0x18);
      auVar69._0_10_ = (unkuint10)CONCAT11(bVar10,uVar92) << 0x38;
      uVar288 = CONCAT62(auVar69._9_6_,CONCAT11(auVar391[0xb],uVar92));
      auVar199._7_8_ = 0;
      auVar199._0_7_ = (uint7)((ulong)uVar288 >> 8);
      Var188 = CONCAT81(SUB158(auVar199 << 0x40,7),auVar391[5]);
      auVar293._9_6_ = 0;
      auVar293._0_9_ = Var188;
      auVar200._1_10_ = SUB1510(auVar293 << 0x30,5);
      auVar200[0] = auVar516[0xf];
      auVar294._11_4_ = 0;
      auVar294._0_11_ = auVar200;
      auVar201._1_12_ = SUB1512(auVar294 << 0x20,3);
      auVar201[0] = auVar516[9];
      auVar25[0xd] = 0;
      auVar25._0_13_ = auVar543._0_13_;
      auVar25[0xe] = puVar2[0xe];
      auVar37[0xc] = puVar2[8];
      auVar37._0_12_ = auVar543._0_12_;
      auVar37._13_2_ = auVar25._13_2_;
      auVar48[0xb] = 0;
      auVar48._0_11_ = auVar543._0_11_;
      auVar48._12_3_ = auVar37._12_3_;
      auVar60[10] = puVar2[2];
      auVar60._0_10_ = auVar543._0_10_;
      auVar60._11_4_ = auVar48._11_4_;
      auVar70[9] = 0;
      auVar70._0_9_ = auVar543._0_9_;
      auVar70._10_5_ = auVar60._10_5_;
      auVar82[8] = auVar391[0xc];
      auVar82._0_8_ = auVar543._0_8_;
      auVar82._9_6_ = auVar70._9_6_;
      auVar202._7_8_ = 0;
      auVar202._0_7_ = auVar82._8_7_;
      Var192 = CONCAT81(SUB158(auVar202 << 0x40,7),auVar391[6]);
      auVar295._9_6_ = 0;
      auVar295._0_9_ = Var192;
      auVar203._1_10_ = SUB1510(auVar295 << 0x30,5);
      auVar203[0] = auVar391[0];
      auVar296._11_4_ = 0;
      auVar296._0_11_ = auVar203;
      auVar204._1_12_ = SUB1512(auVar296 << 0x20,3);
      auVar204[0] = auVar516[10];
      auVar341._6_8_ = 0;
      auVar26[0xe] = uVar93;
      auVar26._0_14_ = auVar341 << 0x38;
      uVar342 = CONCAT26(auVar26._13_2_,CONCAT15(puVar2[9],uVar325));
      auVar329._4_8_ = 0;
      auVar329._0_4_ = uVar322;
      auVar49._12_3_ = (int3)((ulong)uVar342 >> 0x28);
      auVar49._0_12_ = auVar329 << 0x38;
      uVar330 = CONCAT44(auVar49._11_4_,CONCAT13(puVar2[3],uVar285));
      auVar71._10_5_ = (int5)((ulong)uVar330 >> 0x18);
      auVar71._0_10_ = (unkuint10)CONCAT11(bVar96,uVar93) << 0x38;
      uVar297 = CONCAT62(auVar71._9_6_,CONCAT11(auVar391[0xd],uVar93));
      auVar205._7_8_ = 0;
      auVar205._0_7_ = (uint7)((ulong)uVar297 >> 8);
      Var196 = CONCAT81(SUB158(auVar205 << 0x40,7),auVar391[7]);
      auVar298._9_6_ = 0;
      auVar298._0_9_ = Var196;
      auVar206._1_10_ = SUB1510(auVar298 << 0x30,5);
      auVar206[0] = auVar391[1];
      auVar299._11_4_ = 0;
      auVar299._0_11_ = auVar206;
      auVar207._1_12_ = SUB1512(auVar299 << 0x20,3);
      auVar207[0] = auVar516[0xb];
      sVar494 = (short)Var188;
      sVar495 = (short)((ulong)uVar288 >> 8);
      sVar505 = (short)((ulong)uVar328 >> 0x18);
      sVar517 = (short)((ulong)uVar340 >> 0x28);
      uVar90 = auVar24._13_2_ >> 8;
      sVar400 = (short)Var196;
      sVar402 = (short)((ulong)uVar297 >> 8);
      sVar404 = (short)((ulong)uVar330 >> 0x18);
      sVar416 = (short)((ulong)uVar342 >> 0x28);
      uVar380 = auVar26._13_2_ >> 8;
      uVar357 = (ushort)(sVar470 * (ushort)bVar381 +
                        (ushort)auVar516[4] * sVar474 + sVar471 * (ushort)bVar377) >> 8;
      uVar375 = (ushort)(sVar472 * auVar207._0_2_ +
                        auVar204._0_2_ * sVar475 + sVar473 * auVar201._0_2_) >> 8;
      uVar379 = (ushort)(sVar470 * auVar206._0_2_ +
                        auVar203._0_2_ * sVar474 + sVar471 * auVar200._0_2_) >> 8;
      uVar383 = (ushort)(sVar472 * sVar400 + (short)Var192 * sVar475 + sVar473 * sVar494) >> 8;
      uVar384 = (ushort)(sVar470 * sVar402 + auVar82._8_2_ * sVar474 + sVar471 * sVar495) >> 8;
      uVar385 = (ushort)(sVar472 * sVar404 + auVar60._10_2_ * sVar475 + sVar473 * sVar505) >> 8;
      uVar386 = (ushort)(sVar470 * sVar416 + auVar37._12_2_ * sVar474 + sVar471 * sVar517) >> 8;
      uVar387 = (ushort)(sVar472 * uVar380 + (auVar25._13_2_ >> 8) * sVar475 + sVar473 * uVar90) >>
                8;
      auVar391 = pshuflw(ZEXT116(RGB2YUV[uVar350].y_factor),ZEXT116(RGB2YUV[uVar350].y_factor),0);
      sVar523 = auVar391._0_2_;
      sVar525 = auVar391._2_2_;
      auVar391 = pshuflw(ZEXT116(RGB2YUV[uVar350].y_offset),ZEXT116(RGB2YUV[uVar350].y_offset),0);
      sVar477 = auVar391._0_2_;
      sVar414 = ((ushort)(uVar413 * sVar523) >> 7) + sVar477;
      sVar479 = auVar391._2_2_;
      sVar425 = ((ushort)(uVar424 * sVar525) >> 7) + sVar479;
      sVar428 = ((ushort)(uVar427 * sVar523) >> 7) + sVar477;
      sVar431 = ((ushort)(uVar430 * sVar525) >> 7) + sVar479;
      sVar434 = ((ushort)(uVar433 * sVar523) >> 7) + sVar477;
      sVar437 = ((ushort)(uVar436 * sVar525) >> 7) + sVar479;
      sVar441 = ((ushort)(uVar440 * sVar523) >> 7) + sVar477;
      sVar445 = ((ushort)(uVar444 * sVar525) >> 7) + sVar479;
      sVar451 = ((ushort)(uVar357 * sVar523) >> 7) + sVar477;
      sVar460 = ((ushort)(uVar375 * sVar525) >> 7) + sVar479;
      sVar461 = ((ushort)(uVar379 * sVar523) >> 7) + sVar477;
      sVar462 = ((ushort)(uVar383 * sVar525) >> 7) + sVar479;
      sVar463 = ((ushort)(uVar384 * sVar523) >> 7) + sVar477;
      sVar464 = ((ushort)(uVar385 * sVar525) >> 7) + sVar479;
      sVar465 = ((ushort)(uVar386 * sVar523) >> 7) + sVar477;
      sVar466 = ((ushort)(uVar387 * sVar525) >> 7) + sVar479;
      bVar3 = (0 < sVar414) * (sVar414 < 0x100) * (char)sVar414 - (0xff < sVar414);
      cVar4 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      cVar5 = (0 < sVar428) * (sVar428 < 0x100) * (char)sVar428 - (0xff < sVar428);
      cVar6 = (0 < sVar431) * (sVar431 < 0x100) * (char)sVar431 - (0xff < sVar431);
      cVar7 = (0 < sVar434) * (sVar434 < 0x100) * (char)sVar434 - (0xff < sVar434);
      cVar8 = (0 < sVar437) * (sVar437 < 0x100) * (char)sVar437 - (0xff < sVar437);
      cVar9 = (0 < sVar441) * (sVar441 < 0x100) * (char)sVar441 - (0xff < sVar441);
      bVar10 = (0 < sVar445) * (sVar445 < 0x100) * (char)sVar445 - (0xff < sVar445);
      bVar11 = (0 < sVar451) * (sVar451 < 0x100) * (char)sVar451 - (0xff < sVar451);
      bVar12 = (0 < sVar460) * (sVar460 < 0x100) * (char)sVar460 - (0xff < sVar460);
      uVar283 = CONCAT12(bVar12,CONCAT11(bVar11,bVar10));
      bVar13 = (0 < sVar461) * (sVar461 < 0x100) * (char)sVar461 - (0xff < sVar461);
      uVar320 = CONCAT13(bVar13,uVar283);
      bVar14 = (0 < sVar462) * (sVar462 < 0x100) * (char)sVar462 - (0xff < sVar462);
      uVar323 = CONCAT14(bVar14,uVar320);
      bVar15 = (0 < sVar463) * (sVar463 < 0x100) * (char)sVar463 - (0xff < sVar463);
      auVar343[5] = bVar15;
      auVar343._0_5_ = uVar323;
      bVar16 = (0 < sVar464) * (sVar464 < 0x100) * (char)sVar464 - (0xff < sVar464);
      bVar17 = (0 < sVar465) * (sVar465 < 0x100) * (char)sVar465 - (0xff < sVar465);
      bVar18 = (0 < sVar466) * (sVar466 < 0x100) * (char)sVar466 - (0xff < sVar466);
      auVar343._6_8_ = 0;
      auVar27[0xe] = bVar10;
      auVar27._0_14_ = auVar343 << 0x38;
      uVar328 = CONCAT26(auVar27._13_2_,CONCAT15(cVar9,uVar323));
      auVar331._4_8_ = 0;
      auVar331._0_4_ = uVar320;
      auVar50._12_3_ = (int3)((ulong)uVar328 >> 0x28);
      auVar50._0_12_ = auVar331 << 0x38;
      uVar297 = CONCAT44(auVar50._11_4_,CONCAT13(cVar8,uVar283));
      auVar72._10_5_ = (int5)((ulong)uVar297 >> 0x18);
      auVar72._0_10_ = (unkuint10)CONCAT11(bVar11,bVar10) << 0x38;
      uVar288 = CONCAT62(auVar72._9_6_,CONCAT11(cVar7,bVar10));
      auVar208._7_8_ = 0;
      auVar208._0_7_ = (uint7)((ulong)uVar288 >> 8);
      Var188 = CONCAT81(SUB158(auVar208 << 0x40,7),cVar6);
      auVar300._9_6_ = 0;
      auVar300._0_9_ = Var188;
      auVar209._1_10_ = SUB1510(auVar300 << 0x30,5);
      auVar209[0] = cVar5;
      auVar301._11_4_ = 0;
      auVar301._0_11_ = auVar209;
      auVar210._1_12_ = SUB1512(auVar301 << 0x20,3);
      auVar210[0] = cVar4;
      uVar389 = (ushort)bVar3;
      sVar414 = (short)((ulong)uVar288 >> 8);
      sVar425 = (short)((ulong)uVar297 >> 0x18);
      sVar428 = (short)((ulong)uVar328 >> 0x28);
      uVar396 = (ushort)Var188;
      uVar395 = auVar209._0_2_;
      uVar394 = auVar210._0_2_;
      puVar2 = Y + lVar353 + uVar354;
      *puVar2 = (uVar389 != 0) * (uVar389 < 0x100) * bVar3 - (0xff < uVar389);
      puVar2[1] = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
      puVar2[2] = (uVar394 != 0) * (uVar394 < 0x100) * cVar4 - (0xff < uVar394);
      puVar2[3] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
      puVar2[4] = (uVar395 != 0) * (uVar395 < 0x100) * cVar5 - (0xff < uVar395);
      puVar2[5] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
      puVar2[6] = (uVar396 != 0) * (uVar396 < 0x100) * cVar6 - (0xff < uVar396);
      puVar2[7] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
      puVar2[8] = (0 < sVar414) * (sVar414 < 0x100) * cVar7 - (0xff < sVar414);
      puVar2[9] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      puVar2[10] = (0 < sVar425) * (sVar425 < 0x100) * cVar8 - (0xff < sVar425);
      puVar2[0xb] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
      puVar2[0xc] = (0 < sVar428) * (sVar428 < 0x100) * cVar9 - (0xff < sVar428);
      puVar2[0xd] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[0xe] = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
      puVar2[0xf] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      uVar389 = (ushort)(sVar470 * (ushort)bVar19 +
                        (ushort)bVar20 * sVar474 + sVar471 * (ushort)bVar94) >> 8;
      uVar394 = (ushort)(sVar472 * (ushort)bVar99 +
                        (ushort)bVar98 * sVar475 + sVar473 * (ushort)bVar97) >> 8;
      uVar395 = (ushort)(sVar470 * (ushort)bVar105 +
                        (ushort)bVar104 * sVar474 + sVar471 * (ushort)bVar103) >> 8;
      uVar396 = (ushort)(sVar472 * (ushort)bVar110 +
                        (auVar448._14_2_ & 0xff) * sVar475 + sVar473 * (ushort)bVar109) >> 8;
      uVar397 = (ushort)(sVar470 * (ushort)bVar115 +
                        (auVar532._14_2_ & 0xff) * sVar474 + sVar471 * (ushort)bVar114) >> 8;
      uVar399 = (ushort)(sVar472 * (ushort)bVar121 +
                        (ushort)bVar120 * sVar475 + sVar473 * (ushort)bVar119) >> 8;
      uVar401 = (ushort)(sVar470 * (ushort)bVar124 +
                        (auVar532._14_2_ >> 8) * sVar474 + sVar471 * (auVar512._14_2_ & 0xff)) >> 8;
      uVar403 = (ushort)(sVar472 * (ushort)bVar127 +
                        (auVar448._14_2_ >> 8) * sVar475 + sVar473 * (auVar512._14_2_ >> 8)) >> 8;
      uVar415 = (ushort)(sVar470 * (ushort)bVar96 +
                        (ushort)bVar95 * sVar474 + sVar471 * (auVar486._14_2_ & 0xff)) >> 8;
      uVar426 = (ushort)(sVar472 * (ushort)bVar102 +
                        (ushort)bVar101 * sVar475 + sVar473 * (ushort)bVar100) >> 8;
      uVar429 = (ushort)(sVar470 * (ushort)bVar108 +
                        (ushort)bVar107 * sVar474 + sVar471 * (ushort)bVar106) >> 8;
      uVar432 = (ushort)(sVar472 * (ushort)bVar113 +
                        (ushort)bVar112 * sVar475 + sVar473 * (ushort)bVar111) >> 8;
      uVar435 = (ushort)(sVar470 * (ushort)bVar118 +
                        (ushort)bVar117 * sVar474 + sVar471 * (ushort)bVar116) >> 8;
      uVar438 = (ushort)(sVar472 * (ushort)bVar123 +
                        (ushort)bVar122 * sVar475 + sVar473 * (auVar388._14_2_ & 0xff)) >> 8;
      uVar442 = (ushort)(sVar470 * (ushort)bVar126 +
                        (auVar549._14_2_ & 0xff) * sVar474 + sVar471 * (ushort)bVar125) >> 8;
      uVar446 = (ushort)(sVar472 * (ushort)bVar129 +
                        (auVar549._14_2_ >> 8) * sVar475 + sVar473 * (ushort)bVar128) >> 8;
      sVar414 = uVar357 + uVar413 + uVar415 + uVar389;
      sVar428 = uVar375 + uVar424 + uVar426 + uVar394;
      sVar434 = uVar379 + uVar427 + uVar429 + uVar395;
      sVar441 = uVar383 + uVar430 + uVar432 + uVar396;
      sVar451 = uVar384 + uVar433 + uVar435 + uVar397;
      sVar460 = uVar385 + uVar436 + uVar438 + uVar399;
      sVar461 = uVar386 + uVar440 + uVar442 + uVar401;
      sVar462 = uVar387 + uVar444 + uVar446 + uVar403;
      auVar449._0_2_ =
           ((ushort)bVar381 + (ushort)bVar373 + (ushort)bVar96 + (ushort)bVar19) - sVar414;
      auVar449._2_2_ =
           (auVar207._0_2_ + auVar198._0_2_ + (ushort)bVar102 + (ushort)bVar99) - sVar428;
      auVar449._4_2_ =
           (auVar206._0_2_ + auVar197._0_2_ + (ushort)bVar108 + (ushort)bVar105) - sVar434;
      auVar449._6_2_ = (sVar400 + sVar398 + (ushort)bVar113 + (ushort)bVar110) - sVar441;
      auVar449._8_2_ = (sVar402 + auVar81._8_2_ + (ushort)bVar118 + (ushort)bVar115) - sVar451;
      auVar449._10_2_ = (sVar404 + auVar59._10_2_ + (ushort)bVar123 + (ushort)bVar121) - sVar460;
      auVar449._12_2_ = (sVar416 + auVar36._12_2_ + (ushort)bVar126 + (ushort)bVar124) - sVar461;
      auVar449._14_2_ = (uVar380 + (uVar376 >> 8) + (ushort)bVar129 + (ushort)bVar127) - sVar462;
      sVar425 = ((ushort)(uVar389 * sVar523) >> 7) + sVar477;
      sVar431 = ((ushort)(uVar394 * sVar525) >> 7) + sVar479;
      sVar437 = ((ushort)(uVar395 * sVar523) >> 7) + sVar477;
      sVar445 = ((ushort)(uVar396 * sVar525) >> 7) + sVar479;
      sVar398 = ((ushort)(uVar397 * sVar523) >> 7) + sVar477;
      sVar400 = ((ushort)(uVar399 * sVar525) >> 7) + sVar479;
      sVar402 = ((ushort)(uVar401 * sVar523) >> 7) + sVar477;
      sVar404 = ((ushort)(uVar403 * sVar525) >> 7) + sVar479;
      sVar416 = ((ushort)(uVar415 * sVar523) >> 7) + sVar477;
      sVar463 = ((ushort)(uVar426 * sVar525) >> 7) + sVar479;
      sVar464 = ((ushort)(uVar429 * sVar523) >> 7) + sVar477;
      sVar465 = ((ushort)(uVar432 * sVar525) >> 7) + sVar479;
      sVar466 = ((ushort)(uVar435 * sVar523) >> 7) + sVar477;
      sVar439 = ((ushort)(uVar438 * sVar525) >> 7) + sVar479;
      sVar443 = ((ushort)(uVar442 * sVar523) >> 7) + sVar477;
      sVar447 = ((ushort)(uVar446 * sVar525) >> 7) + sVar479;
      bVar16 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      cVar5 = (0 < sVar431) * (sVar431 < 0x100) * (char)sVar431 - (0xff < sVar431);
      cVar6 = (0 < sVar437) * (sVar437 < 0x100) * (char)sVar437 - (0xff < sVar437);
      cVar7 = (0 < sVar445) * (sVar445 < 0x100) * (char)sVar445 - (0xff < sVar445);
      cVar8 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
      cVar9 = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
      cVar4 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
      bVar18 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
      bVar17 = (0 < sVar416) * (sVar416 < 0x100) * (char)sVar416 - (0xff < sVar416);
      bVar15 = (0 < sVar463) * (sVar463 < 0x100) * (char)sVar463 - (0xff < sVar463);
      uVar283 = CONCAT12(bVar15,CONCAT11(bVar17,bVar18));
      bVar3 = (0 < sVar464) * (sVar464 < 0x100) * (char)sVar464 - (0xff < sVar464);
      uVar320 = CONCAT13(bVar3,uVar283);
      bVar14 = (0 < sVar465) * (sVar465 < 0x100) * (char)sVar465 - (0xff < sVar465);
      uVar323 = CONCAT14(bVar14,uVar320);
      bVar13 = (0 < sVar466) * (sVar466 < 0x100) * (char)sVar466 - (0xff < sVar466);
      auVar344[5] = bVar13;
      auVar344._0_5_ = uVar323;
      bVar10 = (0 < sVar439) * (sVar439 < 0x100) * (char)sVar439 - (0xff < sVar439);
      bVar12 = (0 < sVar443) * (sVar443 < 0x100) * (char)sVar443 - (0xff < sVar443);
      bVar11 = (0 < sVar447) * (sVar447 < 0x100) * (char)sVar447 - (0xff < sVar447);
      auVar344._6_8_ = 0;
      auVar28[0xe] = bVar18;
      auVar28._0_14_ = auVar344 << 0x38;
      uVar328 = CONCAT26(auVar28._13_2_,CONCAT15(cVar4,uVar323));
      auVar332._4_8_ = 0;
      auVar332._0_4_ = uVar320;
      auVar51._12_3_ = (int3)((ulong)uVar328 >> 0x28);
      auVar51._0_12_ = auVar332 << 0x38;
      uVar297 = CONCAT44(auVar51._11_4_,CONCAT13(cVar9,uVar283));
      auVar73._10_5_ = (int5)((ulong)uVar297 >> 0x18);
      auVar73._0_10_ = (unkuint10)CONCAT11(bVar17,bVar18) << 0x38;
      uVar288 = CONCAT62(auVar73._9_6_,CONCAT11(cVar8,bVar18));
      auVar211._7_8_ = 0;
      auVar211._0_7_ = (uint7)((ulong)uVar288 >> 8);
      Var188 = CONCAT81(SUB158(auVar211 << 0x40,7),cVar7);
      auVar302._9_6_ = 0;
      auVar302._0_9_ = Var188;
      auVar212._1_10_ = SUB1510(auVar302 << 0x30,5);
      auVar212[0] = cVar6;
      auVar303._11_4_ = 0;
      auVar303._0_11_ = auVar212;
      auVar213._1_12_ = SUB1512(auVar303 << 0x20,3);
      auVar213[0] = cVar5;
      uVar376 = (ushort)bVar16;
      sVar425 = (short)((ulong)uVar288 >> 8);
      sVar431 = (short)((ulong)uVar297 >> 0x18);
      sVar437 = (short)((ulong)uVar328 >> 0x28);
      uVar357 = (ushort)Var188;
      uVar389 = auVar212._0_2_;
      uVar380 = auVar213._0_2_;
      puVar2 = Y + lVar353 + (ulong)Y_stride;
      *puVar2 = (uVar376 != 0) * (uVar376 < 0x100) * bVar16 - (0xff < uVar376);
      puVar2[1] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[2] = (uVar380 != 0) * (uVar380 < 0x100) * cVar5 - (0xff < uVar380);
      puVar2[3] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      puVar2[4] = (uVar389 != 0) * (uVar389 < 0x100) * cVar6 - (0xff < uVar389);
      puVar2[5] = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
      puVar2[6] = (uVar357 != 0) * (uVar357 < 0x100) * cVar7 - (0xff < uVar357);
      puVar2[7] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
      puVar2[8] = (0 < sVar425) * (sVar425 < 0x100) * cVar8 - (0xff < sVar425);
      puVar2[9] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
      puVar2[10] = (0 < sVar431) * (sVar431 < 0x100) * cVar9 - (0xff < sVar431);
      puVar2[0xb] = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
      puVar2[0xc] = (0 < sVar437) * (sVar437 < 0x100) * cVar4 - (0xff < sVar437);
      puVar2[0xd] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
      puVar2[0xe] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      puVar2[0xf] = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
      auVar391 = *(undefined1 (*) [16])(puVar352 + (ulong)uVar356 + 0x30);
      auVar390 = *(undefined1 (*) [16])(puVar352 + (ulong)uVar356 + 0x40);
      puVar2 = puVar352 + (ulong)uVar356 + 0x50;
      uVar91 = puVar2[0xb];
      uVar92 = puVar2[0xd];
      uVar93 = puVar2[0xf];
      pbVar1 = puVar352 + (ulong)RGB_stride + 0x30;
      bVar95 = *pbVar1;
      bVar96 = pbVar1[1];
      bVar98 = pbVar1[2];
      bVar10 = pbVar1[3];
      bVar99 = pbVar1[4];
      bVar101 = pbVar1[5];
      bVar102 = pbVar1[6];
      bVar104 = pbVar1[7];
      bVar105 = pbVar1[8];
      bVar107 = pbVar1[9];
      bVar108 = pbVar1[10];
      bVar110 = pbVar1[0xb];
      bVar112 = pbVar1[0xc];
      bVar113 = pbVar1[0xd];
      bVar115 = pbVar1[0xe];
      bVar117 = pbVar1[0xf];
      pbVar1 = puVar352 + (ulong)RGB_stride + 0x40;
      bVar118 = *pbVar1;
      bVar120 = pbVar1[1];
      bVar121 = pbVar1[2];
      bVar11 = pbVar1[3];
      bVar122 = pbVar1[4];
      bVar123 = pbVar1[5];
      bVar124 = pbVar1[6];
      bVar126 = pbVar1[7];
      bVar127 = pbVar1[8];
      bVar12 = pbVar1[9];
      bVar129 = pbVar1[10];
      bVar373 = pbVar1[0xb];
      bVar381 = pbVar1[0xc];
      bVar130 = pbVar1[0xd];
      bVar131 = pbVar1[0xe];
      bVar132 = pbVar1[0xf];
      pbVar1 = puVar352 + (ulong)RGB_stride + 0x50;
      bVar133 = *pbVar1;
      bVar134 = pbVar1[2];
      bVar135 = pbVar1[3];
      bVar136 = pbVar1[6];
      bVar137 = pbVar1[7];
      bVar138 = pbVar1[9];
      bVar139 = pbVar1[0xc];
      bVar140 = pbVar1[0xd];
      bVar141 = pbVar1[0xf];
      auVar372._0_14_ = auVar391._0_14_;
      auVar372[0xe] = auVar391[7];
      auVar372[0xf] = bVar104;
      auVar371._14_2_ = auVar372._14_2_;
      auVar371._0_13_ = auVar391._0_13_;
      auVar371[0xd] = bVar102;
      auVar370._13_3_ = auVar371._13_3_;
      auVar370._0_12_ = auVar391._0_12_;
      auVar370[0xc] = auVar391[6];
      auVar369._12_4_ = auVar370._12_4_;
      auVar369._0_11_ = auVar391._0_11_;
      auVar369[0xb] = bVar101;
      bVar382 = auVar391[5];
      auVar368._11_5_ = auVar369._11_5_;
      auVar368._0_10_ = auVar391._0_10_;
      auVar368[10] = bVar382;
      auVar367._10_6_ = auVar368._10_6_;
      auVar367._0_9_ = auVar391._0_9_;
      auVar367[9] = bVar99;
      auVar366._9_7_ = auVar367._9_7_;
      auVar366._0_8_ = auVar391._0_8_;
      auVar366[8] = auVar391[4];
      auVar218._1_8_ = auVar366._8_8_;
      auVar218[0] = bVar10;
      bVar378 = auVar391[3];
      auVar218._9_7_ = 0;
      auVar217._10_6_ = 0;
      auVar217._0_10_ = SUB1610(auVar218 << 0x38,6);
      bVar374 = auVar391[2];
      auVar216._11_5_ = 0;
      auVar216._0_11_ = SUB1611(auVar217 << 0x30,5);
      auVar215._12_4_ = 0;
      auVar215._0_12_ = SUB1612(auVar216 << 0x28,4);
      auVar214._13_3_ = 0;
      auVar214._0_13_ = SUB1613(auVar215 << 0x20,3);
      auVar365._14_2_ = 0;
      auVar365._0_14_ = SUB1614(auVar214 << 0x18,2);
      auVar365 = auVar365 << 0x10;
      auVar458._0_14_ = auVar390._0_14_;
      auVar458[0xe] = auVar390[7];
      auVar458[0xf] = bVar126;
      auVar457._14_2_ = auVar458._14_2_;
      auVar457._0_13_ = auVar390._0_13_;
      auVar457[0xd] = bVar124;
      auVar456._13_3_ = auVar457._13_3_;
      auVar456._0_12_ = auVar390._0_12_;
      auVar456[0xc] = auVar390[6];
      auVar455._12_4_ = auVar456._12_4_;
      auVar455._0_11_ = auVar390._0_11_;
      auVar455[0xb] = bVar123;
      auVar454._11_5_ = auVar455._11_5_;
      auVar454._0_10_ = auVar390._0_10_;
      auVar454[10] = auVar390[5];
      auVar453._10_6_ = auVar454._10_6_;
      auVar453._0_9_ = auVar390._0_9_;
      auVar453[9] = bVar122;
      auVar452._9_7_ = auVar453._9_7_;
      auVar452._0_8_ = auVar390._0_8_;
      auVar452[8] = auVar390[4];
      auVar223._1_8_ = auVar452._8_8_;
      auVar223[0] = bVar11;
      auVar223._9_7_ = 0;
      auVar222._10_6_ = 0;
      auVar222._0_10_ = SUB1610(auVar223 << 0x38,6);
      auVar221._11_5_ = 0;
      auVar221._0_11_ = SUB1611(auVar222 << 0x30,5);
      auVar220._12_4_ = 0;
      auVar220._0_12_ = SUB1612(auVar221 << 0x28,4);
      auVar219._13_3_ = 0;
      auVar219._0_13_ = SUB1613(auVar220 << 0x20,3);
      auVar467._0_14_ = SUB1614(auVar219 << 0x18,2) << 0x10;
      auVar558._0_14_ = auVar365._0_14_;
      auVar558[0xe] = bVar10;
      auVar558[0xf] = bVar373;
      auVar557._14_2_ = auVar558._14_2_;
      auVar557._0_13_ = auVar365._0_13_;
      auVar557[0xd] = auVar390[0xb];
      auVar556._13_3_ = auVar557._13_3_;
      auVar556._0_12_ = auVar365._0_12_;
      auVar556[0xc] = bVar378;
      auVar555._12_4_ = auVar556._12_4_;
      auVar555._0_11_ = auVar365._0_11_;
      auVar555[0xb] = bVar129;
      auVar554._11_5_ = auVar555._11_5_;
      auVar554._0_10_ = auVar365._0_10_;
      auVar554[10] = bVar98;
      auVar553._10_6_ = auVar554._10_6_;
      auVar553._0_9_ = auVar365._0_9_;
      auVar553[9] = auVar390[10];
      auVar552._9_7_ = auVar553._9_7_;
      auVar552._0_8_ = auVar365._0_8_;
      auVar552[8] = bVar374;
      auVar228._1_8_ = auVar552._8_8_;
      auVar228[0] = bVar12;
      auVar228._9_7_ = 0;
      auVar227._10_6_ = 0;
      auVar227._0_10_ = SUB1610(auVar228 << 0x38,6);
      auVar226._11_5_ = 0;
      auVar226._0_11_ = SUB1611(auVar227 << 0x30,5);
      auVar225._12_4_ = 0;
      auVar225._0_12_ = SUB1612(auVar226 << 0x28,4);
      auVar224._13_3_ = 0;
      auVar224._0_13_ = SUB1613(auVar225 << 0x20,3);
      auVar551._14_2_ = 0;
      auVar551._0_14_ = SUB1614(auVar224 << 0x18,2);
      auVar551 = auVar551 << 0x10;
      auVar233._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar135,bVar110),
                                                                        puVar2[3]),auVar391[0xb]),
                                                      bVar134),bVar108),puVar2[2]),
                           CONCAT11(auVar391[10],bVar110)) >> 8);
      auVar233[0] = pbVar1[1];
      auVar233._9_7_ = 0;
      auVar232._10_6_ = 0;
      auVar232._0_10_ = SUB1610(auVar233 << 0x38,6);
      auVar231._11_5_ = 0;
      auVar231._0_11_ = SUB1611(auVar232 << 0x30,5);
      auVar230._12_4_ = 0;
      auVar230._0_12_ = SUB1612(auVar231 << 0x28,4);
      auVar229._13_3_ = 0;
      auVar229._0_13_ = SUB1613(auVar230 << 0x20,3);
      auVar392._0_14_ = SUB1614(auVar229 << 0x18,2) << 0x10;
      auVar467[0xe] = bVar11;
      auVar467[0xf] = pbVar1[0xb];
      auVar504._0_14_ = auVar551._0_14_;
      auVar504[0xe] = bVar12;
      auVar504[0xf] = pbVar1[5];
      auVar503._14_2_ = auVar504._14_2_;
      auVar503._0_13_ = auVar551._0_13_;
      auVar503[0xd] = bVar113;
      auVar502._13_3_ = auVar503._13_3_;
      auVar502._0_12_ = auVar551._0_12_;
      auVar502[0xc] = bVar96;
      auVar501._12_4_ = auVar502._12_4_;
      auVar501._0_11_ = auVar551._0_11_;
      auVar501[0xb] = puVar2[5];
      auVar500._11_5_ = auVar501._11_5_;
      auVar500._0_10_ = auVar551._0_10_;
      auVar500[10] = auVar390[9];
      auVar499._10_6_ = auVar500._10_6_;
      auVar499._0_9_ = auVar551._0_9_;
      auVar499[9] = auVar391[0xd];
      auVar498._9_7_ = auVar499._9_7_;
      auVar498._0_8_ = auVar551._0_8_;
      auVar498[8] = auVar391[1];
      auVar238._1_8_ = auVar498._8_8_;
      auVar238[0] = pbVar1[4];
      auVar238._9_7_ = 0;
      auVar237._10_6_ = 0;
      auVar237._0_10_ = SUB1610(auVar238 << 0x38,6);
      auVar236._11_5_ = 0;
      auVar236._0_11_ = SUB1611(auVar237 << 0x30,5);
      auVar235._12_4_ = 0;
      auVar235._0_12_ = SUB1612(auVar236 << 0x28,4);
      auVar234._13_3_ = 0;
      auVar234._0_13_ = SUB1613(auVar235 << 0x20,3);
      auVar497._14_2_ = 0;
      auVar497._0_14_ = SUB1614(auVar234 << 0x18,2);
      auVar497 = auVar497 << 0x10;
      auVar243._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar138,bVar130),
                                                                        bVar120),bVar101),puVar2[9])
                                             ,auVar390[0xd]),auVar390[1]),CONCAT11(bVar382,bVar130))
                 >> 8);
      auVar243[0] = pbVar1[8];
      auVar243._9_7_ = 0;
      auVar242._10_6_ = 0;
      auVar242._0_10_ = SUB1610(auVar243 << 0x38,6);
      auVar241._11_5_ = 0;
      auVar241._0_11_ = SUB1611(auVar242 << 0x30,5);
      auVar240._12_4_ = 0;
      auVar240._0_12_ = SUB1612(auVar241 << 0x28,4);
      auVar239._13_3_ = 0;
      auVar239._0_13_ = SUB1613(auVar240 << 0x20,3);
      auVar524._14_2_ = 0;
      auVar524._0_14_ = SUB1614(auVar239 << 0x18,2);
      auVar524 = auVar524 << 0x10;
      auVar392[0xe] = pbVar1[1];
      auVar392[0xf] = bVar140;
      auVar541._0_14_ = auVar497._0_14_;
      auVar541[0xe] = pbVar1[4];
      auVar541[0xf] = pbVar1[10];
      auVar540._14_2_ = auVar541._14_2_;
      auVar540._0_13_ = auVar497._0_13_;
      auVar540[0xd] = bVar131;
      auVar539._13_3_ = auVar540._13_3_;
      auVar539._0_12_ = auVar497._0_12_;
      auVar539[0xc] = bVar127;
      auVar538._12_4_ = auVar539._12_4_;
      auVar538._0_11_ = auVar497._0_11_;
      auVar538[0xb] = bVar121;
      auVar537._11_5_ = auVar538._11_5_;
      auVar537._0_10_ = auVar497._0_10_;
      auVar537[10] = bVar112;
      auVar536._10_6_ = auVar537._10_6_;
      auVar536._0_9_ = auVar497._0_9_;
      auVar536[9] = bVar102;
      auVar535._9_7_ = auVar536._9_7_;
      auVar535._0_8_ = auVar497._0_8_;
      auVar535[8] = bVar95;
      auVar248._1_8_ = auVar535._8_8_;
      auVar248[0] = puVar2[10];
      auVar248._9_7_ = 0;
      auVar247._10_6_ = 0;
      auVar247._0_10_ = SUB1610(auVar248 << 0x38,6);
      auVar246._11_5_ = 0;
      auVar246._0_11_ = SUB1611(auVar247 << 0x30,5);
      auVar245._12_4_ = 0;
      auVar245._0_12_ = SUB1612(auVar246 << 0x28,4);
      auVar244._13_3_ = 0;
      auVar244._0_13_ = SUB1613(auVar245 << 0x20,3);
      auVar534._14_2_ = 0;
      auVar534._0_14_ = SUB1614(auVar244 << 0x18,2);
      auVar534 = auVar534 << 0x10;
      uVar283 = CONCAT12(bVar104,CONCAT11(bVar96,uVar91));
      uVar320 = CONCAT13(bVar113,uVar283);
      uVar323 = CONCAT14(bVar11,uVar320);
      auVar345[5] = bVar12;
      auVar345._0_5_ = uVar323;
      auVar253._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar139,bVar136),
                                                                        bVar133),bVar129),bVar122),
                                             bVar115),bVar105),CONCAT11(bVar98,bVar136)) >> 8);
      auVar253[0] = puVar2[0xc];
      auVar253._9_7_ = 0;
      auVar252._10_6_ = 0;
      auVar252._0_10_ = SUB1610(auVar253 << 0x38,6);
      auVar251._11_5_ = 0;
      auVar251._0_11_ = SUB1611(auVar252 << 0x30,5);
      auVar250._12_4_ = 0;
      auVar250._0_12_ = SUB1612(auVar251 << 0x28,4);
      auVar249._13_3_ = 0;
      auVar249._0_13_ = SUB1613(auVar250 << 0x20,3);
      auVar459._14_2_ = 0;
      auVar459._0_14_ = SUB1614(auVar249 << 0x18,2);
      auVar459 = auVar459 << 0x10;
      uVar284 = CONCAT12(bVar107,CONCAT11(bVar10,uVar92));
      uVar321 = CONCAT13(bVar117,uVar284);
      uVar324 = CONCAT14(bVar123,uVar321);
      auVar346[5] = bVar373;
      auVar346._0_5_ = uVar324;
      auVar412._0_14_ = auVar524._0_14_;
      auVar412[0xe] = pbVar1[8];
      auVar412[0xf] = pbVar1[0xe];
      auVar411._14_2_ = auVar412._14_2_;
      auVar411._0_13_ = auVar524._0_13_;
      auVar411[0xd] = bVar134;
      auVar410._13_3_ = auVar411._13_3_;
      auVar410._0_12_ = auVar524._0_12_;
      auVar410[0xc] = bVar381;
      auVar409._12_4_ = auVar410._12_4_;
      auVar409._0_11_ = auVar524._0_11_;
      auVar409[0xb] = bVar124;
      auVar408._11_5_ = auVar409._11_5_;
      auVar408._0_10_ = auVar524._0_10_;
      auVar408[10] = bVar118;
      auVar407._10_6_ = auVar408._10_6_;
      auVar407._0_9_ = auVar524._0_9_;
      auVar407[9] = bVar108;
      auVar406._9_7_ = auVar407._9_7_;
      auVar406._0_8_ = auVar524._0_8_;
      auVar406[8] = bVar99;
      auVar258._1_8_ = auVar406._8_8_;
      auVar258[0] = puVar2[0xe];
      auVar258._9_7_ = 0;
      auVar257._10_6_ = 0;
      auVar257._0_10_ = SUB1610(auVar258 << 0x38,6);
      auVar256._11_5_ = 0;
      auVar256._0_11_ = SUB1611(auVar257 << 0x30,5);
      auVar255._12_4_ = 0;
      auVar255._0_12_ = SUB1612(auVar256 << 0x28,4);
      auVar254._13_3_ = 0;
      auVar254._0_13_ = SUB1613(auVar255 << 0x20,3);
      auVar405._14_2_ = 0;
      auVar405._0_14_ = SUB1614(auVar254 << 0x18,2);
      auVar405 = auVar405 << 0x10;
      uVar285 = CONCAT12(bVar110,CONCAT11(bVar101,uVar93));
      uVar322 = CONCAT13(bVar120,uVar285);
      uVar325 = CONCAT14(bVar126,uVar322);
      auVar347[5] = bVar130;
      auVar347._0_5_ = uVar325;
      auVar29[0xd] = 0;
      auVar29._0_13_ = auVar534._0_13_;
      auVar29[0xe] = puVar2[10];
      uVar376 = auVar29._13_2_;
      auVar38[0xc] = puVar2[4];
      auVar38._0_12_ = auVar534._0_12_;
      auVar38._13_2_ = uVar376;
      auVar52[0xb] = 0;
      auVar52._0_11_ = auVar534._0_11_;
      auVar52._12_3_ = auVar38._12_3_;
      auVar61[10] = auVar390[0xe];
      auVar61._0_10_ = auVar534._0_10_;
      auVar61._11_4_ = auVar52._11_4_;
      auVar74[9] = 0;
      auVar74._0_9_ = auVar534._0_9_;
      auVar74._10_5_ = auVar61._10_5_;
      auVar83[8] = auVar390[8];
      auVar83._0_8_ = auVar534._0_8_;
      auVar83._9_6_ = auVar74._9_6_;
      auVar259._7_8_ = 0;
      auVar259._0_7_ = auVar83._8_7_;
      Var188 = CONCAT81(SUB158(auVar259 << 0x40,7),auVar390[2]);
      auVar304._9_6_ = 0;
      auVar304._0_9_ = Var188;
      auVar260._1_10_ = SUB1510(auVar304 << 0x30,5);
      auVar260[0] = auVar391[0xc];
      auVar305._11_4_ = 0;
      auVar305._0_11_ = auVar260;
      auVar261._1_12_ = SUB1512(auVar305 << 0x20,3);
      auVar261[0] = auVar391[6];
      auVar345._6_8_ = 0;
      auVar30[0xe] = uVar91;
      auVar30._0_14_ = auVar345 << 0x38;
      uVar340 = CONCAT26(auVar30._13_2_,CONCAT15(puVar2[5],uVar323));
      auVar333._4_8_ = 0;
      auVar333._0_4_ = uVar320;
      auVar53._12_3_ = (int3)((ulong)uVar340 >> 0x28);
      auVar53._0_12_ = auVar333 << 0x38;
      uVar328 = CONCAT44(auVar53._11_4_,CONCAT13(auVar390[0xf],uVar283));
      auVar75._10_5_ = (int5)((ulong)uVar328 >> 0x18);
      auVar75._0_10_ = (unkuint10)CONCAT11(bVar96,uVar91) << 0x38;
      uVar288 = CONCAT62(auVar75._9_6_,CONCAT11(auVar390[9],uVar91));
      auVar262._7_8_ = 0;
      auVar262._0_7_ = (uint7)((ulong)uVar288 >> 8);
      Var192 = CONCAT81(SUB158(auVar262 << 0x40,7),auVar390[3]);
      auVar306._9_6_ = 0;
      auVar306._0_9_ = Var192;
      auVar263._1_10_ = SUB1510(auVar306 << 0x30,5);
      auVar263[0] = auVar391[0xd];
      auVar307._11_4_ = 0;
      auVar307._0_11_ = auVar263;
      auVar264._1_12_ = SUB1512(auVar307 << 0x20,3);
      auVar264[0] = auVar391[7];
      sVar466 = (short)Var188;
      auVar39[0xd] = 0;
      auVar39._0_13_ = auVar459._0_13_;
      auVar39[0xe] = puVar2[0xc];
      uVar380 = auVar39._13_2_;
      auVar54[0xc] = puVar2[6];
      auVar54._0_12_ = auVar459._0_12_;
      auVar54._13_2_ = uVar380;
      auVar62[0xb] = 0;
      auVar62._0_11_ = auVar459._0_11_;
      auVar62._12_3_ = auVar54._12_3_;
      auVar76[10] = *puVar2;
      auVar76._0_10_ = auVar459._0_10_;
      auVar76._11_4_ = auVar62._11_4_;
      auVar84[9] = 0;
      auVar84._0_9_ = auVar459._0_9_;
      auVar84._10_5_ = auVar76._10_5_;
      auVar89[8] = auVar390[10];
      auVar89._0_8_ = auVar459._0_8_;
      auVar89._9_6_ = auVar84._9_6_;
      auVar265._7_8_ = 0;
      auVar265._0_7_ = auVar89._8_7_;
      Var188 = CONCAT81(SUB158(auVar265 << 0x40,7),auVar390[4]);
      auVar308._9_6_ = 0;
      auVar308._0_9_ = Var188;
      auVar266._1_10_ = SUB1510(auVar308 << 0x30,5);
      auVar266[0] = auVar391[0xe];
      auVar309._11_4_ = 0;
      auVar309._0_11_ = auVar266;
      auVar267._1_12_ = SUB1512(auVar309 << 0x20,3);
      auVar267[0] = auVar391[8];
      sVar416 = (short)Var188;
      auVar346._6_8_ = 0;
      auVar31[0xe] = uVar92;
      auVar31._0_14_ = auVar346 << 0x38;
      uVar342 = CONCAT26(auVar31._13_2_,CONCAT15(puVar2[7],uVar324));
      auVar334._4_8_ = 0;
      auVar334._0_4_ = uVar321;
      auVar55._12_3_ = (int3)((ulong)uVar342 >> 0x28);
      auVar55._0_12_ = auVar334 << 0x38;
      uVar330 = CONCAT44(auVar55._11_4_,CONCAT13(puVar2[1],uVar284));
      auVar77._10_5_ = (int5)((ulong)uVar330 >> 0x18);
      auVar77._0_10_ = (unkuint10)CONCAT11(bVar10,uVar92) << 0x38;
      uVar297 = CONCAT62(auVar77._9_6_,CONCAT11(auVar390[0xb],uVar92));
      auVar268._7_8_ = 0;
      auVar268._0_7_ = (uint7)((ulong)uVar297 >> 8);
      Var188 = CONCAT81(SUB158(auVar268 << 0x40,7),auVar390[5]);
      auVar310._9_6_ = 0;
      auVar310._0_9_ = Var188;
      auVar269._1_10_ = SUB1510(auVar310 << 0x30,5);
      auVar269[0] = auVar391[0xf];
      auVar311._11_4_ = 0;
      auVar311._0_11_ = auVar269;
      auVar270._1_12_ = SUB1512(auVar311 << 0x20,3);
      auVar270[0] = auVar391[9];
      auVar32[0xd] = 0;
      auVar32._0_13_ = auVar405._0_13_;
      auVar32[0xe] = puVar2[0xe];
      auVar40[0xc] = puVar2[8];
      auVar40._0_12_ = auVar405._0_12_;
      auVar40._13_2_ = auVar32._13_2_;
      auVar56[0xb] = 0;
      auVar56._0_11_ = auVar405._0_11_;
      auVar56._12_3_ = auVar40._12_3_;
      auVar63[10] = puVar2[2];
      auVar63._0_10_ = auVar405._0_10_;
      auVar63._11_4_ = auVar56._11_4_;
      auVar78[9] = 0;
      auVar78._0_9_ = auVar405._0_9_;
      auVar78._10_5_ = auVar63._10_5_;
      auVar85[8] = auVar390[0xc];
      auVar85._0_8_ = auVar405._0_8_;
      auVar85._9_6_ = auVar78._9_6_;
      auVar271._7_8_ = 0;
      auVar271._0_7_ = auVar85._8_7_;
      Var196 = CONCAT81(SUB158(auVar271 << 0x40,7),auVar390[6]);
      auVar312._9_6_ = 0;
      auVar312._0_9_ = Var196;
      auVar272._1_10_ = SUB1510(auVar312 << 0x30,5);
      auVar272[0] = auVar390[0];
      auVar313._11_4_ = 0;
      auVar313._0_11_ = auVar272;
      auVar273._1_12_ = SUB1512(auVar313 << 0x20,3);
      auVar273[0] = auVar391[10];
      sVar490 = (short)Var188;
      sVar491 = (short)((ulong)uVar297 >> 8);
      sVar492 = (short)((ulong)uVar330 >> 0x18);
      sVar493 = (short)((ulong)uVar342 >> 0x28);
      uVar389 = auVar31._13_2_ >> 8;
      auVar347._6_8_ = 0;
      auVar41[0xe] = uVar93;
      auVar41._0_14_ = auVar347 << 0x38;
      uVar342 = CONCAT26(auVar41._13_2_,CONCAT15(puVar2[9],uVar325));
      auVar335._4_8_ = 0;
      auVar335._0_4_ = uVar322;
      auVar64._12_3_ = (int3)((ulong)uVar342 >> 0x28);
      auVar64._0_12_ = auVar335 << 0x38;
      uVar330 = CONCAT44(auVar64._11_4_,CONCAT13(puVar2[3],uVar285));
      auVar86._10_5_ = (int5)((ulong)uVar330 >> 0x18);
      auVar86._0_10_ = (unkuint10)CONCAT11(bVar101,uVar93) << 0x38;
      uVar297 = CONCAT62(auVar86._9_6_,CONCAT11(auVar390[0xd],uVar93));
      auVar274._7_8_ = 0;
      auVar274._0_7_ = (uint7)((ulong)uVar297 >> 8);
      Var188 = CONCAT81(SUB158(auVar274 << 0x40,7),auVar390[7]);
      auVar314._9_6_ = 0;
      auVar314._0_9_ = Var188;
      auVar275._1_10_ = SUB1510(auVar314 << 0x30,5);
      auVar275[0] = auVar390[1];
      auVar315._11_4_ = 0;
      auVar315._0_11_ = auVar275;
      auVar276._1_12_ = SUB1512(auVar315 << 0x20,3);
      auVar276[0] = auVar391[0xb];
      sVar518 = (short)Var188;
      sVar519 = (short)((ulong)uVar297 >> 8);
      sVar520 = (short)((ulong)uVar330 >> 0x18);
      sVar522 = (short)((ulong)uVar342 >> 0x28);
      uVar357 = auVar41._13_2_ >> 8;
      uVar424 = (ushort)(sVar470 * (ushort)bVar374 +
                        (ushort)auVar391[1] * sVar474 + sVar471 * (ushort)auVar391[0]) >> 8;
      uVar426 = (ushort)(sVar472 * auVar267._0_2_ +
                        auVar264._0_2_ * sVar475 + sVar473 * auVar261._0_2_) >> 8;
      uVar427 = (ushort)(sVar470 * auVar266._0_2_ +
                        auVar263._0_2_ * sVar474 + sVar471 * auVar260._0_2_) >> 8;
      uVar429 = (ushort)(sVar472 * sVar416 + (short)Var192 * sVar475 + sVar473 * sVar466) >> 8;
      uVar430 = (ushort)(sVar470 * auVar89._8_2_ +
                        (short)((ulong)uVar288 >> 8) * sVar474 + sVar471 * auVar83._8_2_) >> 8;
      uVar432 = (ushort)(sVar472 * auVar76._10_2_ +
                        (short)((ulong)uVar328 >> 0x18) * sVar475 + sVar473 * auVar61._10_2_) >> 8;
      uVar433 = (ushort)(sVar470 * auVar54._12_2_ +
                        (short)((ulong)uVar340 >> 0x28) * sVar474 + sVar471 * auVar38._12_2_) >> 8;
      uVar435 = (ushort)(sVar472 * (uVar380 >> 8) +
                        (auVar30._13_2_ >> 8) * sVar475 + sVar473 * (uVar376 >> 8)) >> 8;
      uVar395 = (ushort)(sVar470 * (ushort)bVar382 +
                        (ushort)auVar391[4] * sVar474 + sVar471 * (ushort)bVar378) >> 8;
      uVar396 = (ushort)(sVar472 * auVar276._0_2_ +
                        auVar273._0_2_ * sVar475 + sVar473 * auVar270._0_2_) >> 8;
      uVar397 = (ushort)(sVar470 * auVar275._0_2_ +
                        auVar272._0_2_ * sVar474 + sVar471 * auVar269._0_2_) >> 8;
      uVar399 = (ushort)(sVar472 * sVar518 + (short)Var196 * sVar475 + sVar473 * sVar490) >> 8;
      uVar401 = (ushort)(sVar470 * sVar519 + auVar85._8_2_ * sVar474 + sVar471 * sVar491) >> 8;
      uVar403 = (ushort)(sVar472 * sVar520 + auVar63._10_2_ * sVar475 + sVar473 * sVar492) >> 8;
      uVar413 = (ushort)(sVar470 * sVar522 + auVar40._12_2_ * sVar474 + sVar471 * sVar493) >> 8;
      uVar415 = (ushort)(sVar472 * uVar357 + (auVar32._13_2_ >> 8) * sVar475 + sVar473 * uVar389) >>
                8;
      sVar463 = ((ushort)(uVar424 * sVar523) >> 7) + sVar477;
      sVar464 = ((ushort)(uVar426 * sVar525) >> 7) + sVar479;
      sVar465 = ((ushort)(uVar427 * sVar523) >> 7) + sVar477;
      sVar439 = ((ushort)(uVar429 * sVar525) >> 7) + sVar479;
      sVar443 = ((ushort)(uVar430 * sVar523) >> 7) + sVar477;
      sVar447 = ((ushort)(uVar432 * sVar525) >> 7) + sVar479;
      sVar468 = ((ushort)(uVar433 * sVar523) >> 7) + sVar477;
      sVar469 = ((ushort)(uVar435 * sVar525) >> 7) + sVar479;
      sVar425 = ((ushort)(uVar395 * sVar523) >> 7) + sVar477;
      sVar431 = ((ushort)(uVar396 * sVar525) >> 7) + sVar479;
      sVar437 = ((ushort)(uVar397 * sVar523) >> 7) + sVar477;
      sVar445 = ((ushort)(uVar399 * sVar525) >> 7) + sVar479;
      sVar398 = ((ushort)(uVar401 * sVar523) >> 7) + sVar477;
      sVar400 = ((ushort)(uVar403 * sVar525) >> 7) + sVar479;
      sVar402 = ((ushort)(uVar413 * sVar523) >> 7) + sVar477;
      sVar404 = ((ushort)(uVar415 * sVar525) >> 7) + sVar479;
      bVar19 = (0 < sVar463) * (sVar463 < 0x100) * (char)sVar463 - (0xff < sVar463);
      cVar5 = (0 < sVar464) * (sVar464 < 0x100) * (char)sVar464 - (0xff < sVar464);
      cVar4 = (0 < sVar465) * (sVar465 < 0x100) * (char)sVar465 - (0xff < sVar465);
      cVar9 = (0 < sVar439) * (sVar439 < 0x100) * (char)sVar439 - (0xff < sVar439);
      cVar8 = (0 < sVar443) * (sVar443 < 0x100) * (char)sVar443 - (0xff < sVar443);
      cVar7 = (0 < sVar447) * (sVar447 < 0x100) * (char)sVar447 - (0xff < sVar447);
      cVar6 = (0 < sVar468) * (sVar468 < 0x100) * (char)sVar468 - (0xff < sVar468);
      bVar20 = (0 < sVar469) * (sVar469 < 0x100) * (char)sVar469 - (0xff < sVar469);
      bVar3 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      bVar18 = (0 < sVar431) * (sVar431 < 0x100) * (char)sVar431 - (0xff < sVar431);
      uVar283 = CONCAT12(bVar18,CONCAT11(bVar3,bVar20));
      bVar17 = (0 < sVar437) * (sVar437 < 0x100) * (char)sVar437 - (0xff < sVar437);
      uVar320 = CONCAT13(bVar17,uVar283);
      bVar12 = (0 < sVar445) * (sVar445 < 0x100) * (char)sVar445 - (0xff < sVar445);
      uVar323 = CONCAT14(bVar12,uVar320);
      bVar16 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
      auVar348[5] = bVar16;
      auVar348._0_5_ = uVar323;
      bVar15 = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
      bVar14 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
      bVar13 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
      auVar348._6_8_ = 0;
      auVar33[0xe] = bVar20;
      auVar33._0_14_ = auVar348 << 0x38;
      uVar328 = CONCAT26(auVar33._13_2_,CONCAT15(cVar6,uVar323));
      auVar336._4_8_ = 0;
      auVar336._0_4_ = uVar320;
      auVar57._12_3_ = (int3)((ulong)uVar328 >> 0x28);
      auVar57._0_12_ = auVar336 << 0x38;
      uVar297 = CONCAT44(auVar57._11_4_,CONCAT13(cVar7,uVar283));
      auVar79._10_5_ = (int5)((ulong)uVar297 >> 0x18);
      auVar79._0_10_ = (unkuint10)CONCAT11(bVar3,bVar20) << 0x38;
      uVar288 = CONCAT62(auVar79._9_6_,CONCAT11(cVar8,bVar20));
      auVar277._7_8_ = 0;
      auVar277._0_7_ = (uint7)((ulong)uVar288 >> 8);
      Var188 = CONCAT81(SUB158(auVar277 << 0x40,7),cVar9);
      auVar316._9_6_ = 0;
      auVar316._0_9_ = Var188;
      auVar278._1_10_ = SUB1510(auVar316 << 0x30,5);
      auVar278[0] = cVar4;
      auVar317._11_4_ = 0;
      auVar317._0_11_ = auVar278;
      auVar279._1_12_ = SUB1512(auVar317 << 0x20,3);
      auVar279[0] = cVar5;
      uVar375 = (ushort)bVar19;
      sVar425 = (short)((ulong)uVar288 >> 8);
      sVar431 = (short)((ulong)uVar297 >> 0x18);
      sVar437 = (short)((ulong)uVar328 >> 0x28);
      uVar384 = (ushort)Var188;
      uVar383 = auVar278._0_2_;
      uVar379 = auVar279._0_2_;
      bVar10 = RGB2YUV[uVar350].cb_factor;
      bVar11 = RGB2YUV[uVar350].cr_factor;
      puVar2 = Y + lVar353 + uVar354 + 0x10;
      *puVar2 = (uVar375 != 0) * (uVar375 < 0x100) * bVar19 - (0xff < uVar375);
      puVar2[1] = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
      puVar2[2] = (uVar379 != 0) * (uVar379 < 0x100) * cVar5 - (0xff < uVar379);
      puVar2[3] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      puVar2[4] = (uVar383 != 0) * (uVar383 < 0x100) * cVar4 - (0xff < uVar383);
      puVar2[5] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[6] = (uVar384 != 0) * (uVar384 < 0x100) * cVar9 - (0xff < uVar384);
      puVar2[7] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
      puVar2[8] = (0 < sVar425) * (sVar425 < 0x100) * cVar8 - (0xff < sVar425);
      puVar2[9] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
      puVar2[10] = (0 < sVar431) * (sVar431 < 0x100) * cVar7 - (0xff < sVar431);
      puVar2[0xb] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      puVar2[0xc] = (0 < sVar437) * (sVar437 < 0x100) * cVar6 - (0xff < sVar437);
      puVar2[0xd] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
      puVar2[0xe] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
      puVar2[0xf] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
      uVar375 = (ushort)(sVar470 * (ushort)bVar98 +
                        (ushort)bVar96 * sVar474 + sVar471 * (ushort)bVar95) >> 8;
      uVar379 = (ushort)(sVar472 * (ushort)bVar105 +
                        (ushort)bVar104 * sVar475 + sVar473 * (ushort)bVar102) >> 8;
      uVar383 = (ushort)(sVar470 * (ushort)bVar115 +
                        (ushort)bVar113 * sVar474 + sVar471 * (ushort)bVar112) >> 8;
      uVar384 = (ushort)(sVar472 * (ushort)bVar122 +
                        (auVar467._14_2_ & 0xff) * sVar475 + sVar473 * (ushort)bVar121) >> 8;
      uVar385 = (ushort)(sVar470 * (ushort)bVar129 +
                        (auVar503._14_2_ & 0xff) * sVar474 + sVar471 * (ushort)bVar127) >> 8;
      uVar386 = (ushort)(sVar472 * (ushort)bVar133 +
                        (ushort)bVar132 * sVar475 + sVar473 * (ushort)bVar131) >> 8;
      uVar387 = (ushort)(sVar470 * (ushort)bVar136 +
                        (auVar503._14_2_ >> 8) * sVar474 + sVar471 * (auVar540._14_2_ & 0xff)) >> 8;
      uVar394 = (ushort)(sVar472 * (ushort)bVar139 +
                        (auVar467._14_2_ >> 8) * sVar475 + sVar473 * (auVar540._14_2_ >> 8)) >> 8;
      uVar436 = (ushort)(sVar470 * (ushort)bVar101 +
                        (ushort)bVar99 * sVar474 + sVar471 * (auVar557._14_2_ & 0xff)) >> 8;
      uVar438 = (ushort)(sVar472 * (ushort)bVar110 +
                        (ushort)bVar108 * sVar475 + sVar473 * (ushort)bVar107) >> 8;
      uVar440 = (ushort)(sVar470 * (ushort)bVar120 +
                        (ushort)bVar118 * sVar474 + sVar471 * (ushort)bVar117) >> 8;
      uVar442 = (ushort)(sVar472 * (ushort)bVar126 +
                        (ushort)bVar124 * sVar475 + sVar473 * (ushort)bVar123) >> 8;
      uVar444 = (ushort)(sVar470 * (ushort)bVar130 +
                        (ushort)bVar381 * sVar474 + sVar471 * (ushort)bVar373) >> 8;
      uVar446 = (ushort)(sVar472 * (ushort)bVar135 +
                        (ushort)bVar134 * sVar475 + sVar473 * (auVar392._14_2_ & 0xff)) >> 8;
      uVar476 = (ushort)(sVar470 * (ushort)bVar138 +
                        (auVar411._14_2_ & 0xff) * sVar474 + sVar471 * (ushort)bVar137) >> 8;
      uVar478 = (ushort)(sVar472 * (ushort)bVar141 +
                        (auVar411._14_2_ >> 8) * sVar475 + sVar473 * (ushort)bVar140) >> 8;
      sVar425 = uVar395 + uVar424 + uVar436 + uVar375;
      sVar431 = uVar396 + uVar426 + uVar438 + uVar379;
      sVar437 = uVar397 + uVar427 + uVar440 + uVar383;
      sVar445 = uVar399 + uVar429 + uVar442 + uVar384;
      sVar398 = uVar401 + uVar430 + uVar444 + uVar385;
      sVar400 = uVar403 + uVar432 + uVar446 + uVar386;
      sVar402 = uVar413 + uVar433 + uVar476 + uVar387;
      sVar404 = uVar415 + uVar435 + uVar478 + uVar394;
      auVar514._0_2_ =
           ((ushort)bVar382 + (ushort)bVar374 + (ushort)bVar101 + (ushort)bVar98) - sVar425;
      auVar514._2_2_ =
           (auVar276._0_2_ + auVar267._0_2_ + (ushort)bVar110 + (ushort)bVar105) - sVar431;
      auVar514._4_2_ =
           (auVar275._0_2_ + auVar266._0_2_ + (ushort)bVar120 + (ushort)bVar115) - sVar437;
      auVar514._6_2_ = (sVar518 + sVar416 + (ushort)bVar126 + (ushort)bVar122) - sVar445;
      auVar514._8_2_ = (sVar519 + auVar89._8_2_ + (ushort)bVar130 + (ushort)bVar129) - sVar398;
      auVar514._10_2_ = (sVar520 + auVar76._10_2_ + (ushort)bVar135 + (ushort)bVar133) - sVar400;
      auVar514._12_2_ = (sVar522 + auVar54._12_2_ + (ushort)bVar138 + (ushort)bVar136) - sVar402;
      auVar514._14_2_ = (uVar357 + (uVar380 >> 8) + (ushort)bVar141 + (ushort)bVar139) - sVar404;
      auVar488._0_2_ =
           ((ushort)bVar378 + (ushort)auVar391[0] + (auVar557._14_2_ & 0xff) + (ushort)bVar95) -
           sVar425;
      auVar488._2_2_ =
           (auVar270._0_2_ + auVar261._0_2_ + (ushort)bVar107 + (ushort)bVar102) - sVar431;
      auVar488._4_2_ =
           (auVar269._0_2_ + auVar260._0_2_ + (ushort)bVar117 + (ushort)bVar112) - sVar437;
      auVar488._6_2_ = (sVar490 + sVar466 + (ushort)bVar123 + (ushort)bVar121) - sVar445;
      auVar488._8_2_ = (sVar491 + auVar83._8_2_ + (ushort)bVar373 + (ushort)bVar127) - sVar398;
      auVar488._10_2_ =
           (sVar492 + auVar61._10_2_ + (auVar392._14_2_ & 0xff) + (ushort)bVar131) - sVar400;
      auVar488._12_2_ =
           (sVar493 + auVar38._12_2_ + (ushort)bVar137 + (auVar540._14_2_ & 0xff)) - sVar402;
      auVar488._14_2_ =
           (uVar389 + (uVar376 >> 8) + (ushort)bVar140 + (auVar540._14_2_ >> 8)) - sVar404;
      sVar425 = ((ushort)(uVar375 * sVar523) >> 7) + sVar477;
      sVar431 = ((ushort)(uVar379 * sVar525) >> 7) + sVar479;
      sVar437 = ((ushort)(uVar383 * sVar523) >> 7) + sVar477;
      sVar445 = ((ushort)(uVar384 * sVar525) >> 7) + sVar479;
      sVar398 = ((ushort)(uVar385 * sVar523) >> 7) + sVar477;
      sVar400 = ((ushort)(uVar386 * sVar525) >> 7) + sVar479;
      sVar402 = ((ushort)(uVar387 * sVar523) >> 7) + sVar477;
      sVar404 = ((ushort)(uVar394 * sVar525) >> 7) + sVar479;
      sVar471 = ((ushort)(uVar436 * sVar523) >> 7) + sVar477;
      sVar473 = ((ushort)(uVar438 * sVar525) >> 7) + sVar479;
      sVar474 = ((ushort)(uVar440 * sVar523) >> 7) + sVar477;
      sVar475 = ((ushort)(uVar442 * sVar525) >> 7) + sVar479;
      sVar416 = ((ushort)(uVar444 * sVar523) >> 7) + sVar477;
      sVar463 = ((ushort)(uVar446 * sVar525) >> 7) + sVar479;
      sVar477 = ((ushort)(uVar476 * sVar523) >> 7) + sVar477;
      sVar479 = ((ushort)(uVar478 * sVar525) >> 7) + sVar479;
      bVar20 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      cVar5 = (0 < sVar431) * (sVar431 < 0x100) * (char)sVar431 - (0xff < sVar431);
      cVar6 = (0 < sVar437) * (sVar437 < 0x100) * (char)sVar437 - (0xff < sVar437);
      cVar7 = (0 < sVar445) * (sVar445 < 0x100) * (char)sVar445 - (0xff < sVar445);
      cVar8 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
      cVar9 = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
      cVar4 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
      bVar3 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
      bVar14 = (0 < sVar471) * (sVar471 < 0x100) * (char)sVar471 - (0xff < sVar471);
      bVar18 = (0 < sVar473) * (sVar473 < 0x100) * (char)sVar473 - (0xff < sVar473);
      uVar283 = CONCAT12(bVar18,CONCAT11(bVar14,bVar3));
      bVar17 = (0 < sVar474) * (sVar474 < 0x100) * (char)sVar474 - (0xff < sVar474);
      uVar320 = CONCAT13(bVar17,uVar283);
      bVar19 = (0 < sVar475) * (sVar475 < 0x100) * (char)sVar475 - (0xff < sVar475);
      uVar323 = CONCAT14(bVar19,uVar320);
      bVar16 = (0 < sVar416) * (sVar416 < 0x100) * (char)sVar416 - (0xff < sVar416);
      auVar349[5] = bVar16;
      auVar349._0_5_ = uVar323;
      bVar15 = (0 < sVar463) * (sVar463 < 0x100) * (char)sVar463 - (0xff < sVar463);
      bVar13 = (0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 - (0xff < sVar477);
      bVar12 = (0 < sVar479) * (sVar479 < 0x100) * (char)sVar479 - (0xff < sVar479);
      auVar349._6_8_ = 0;
      auVar42[0xe] = bVar3;
      auVar42._0_14_ = auVar349 << 0x38;
      uVar328 = CONCAT26(auVar42._13_2_,CONCAT15(cVar4,uVar323));
      auVar337._4_8_ = 0;
      auVar337._0_4_ = uVar320;
      auVar65._12_3_ = (int3)((ulong)uVar328 >> 0x28);
      auVar65._0_12_ = auVar337 << 0x38;
      uVar297 = CONCAT44(auVar65._11_4_,CONCAT13(cVar9,uVar283));
      auVar87._10_5_ = (int5)((ulong)uVar297 >> 0x18);
      auVar87._0_10_ = (unkuint10)CONCAT11(bVar14,bVar3) << 0x38;
      uVar288 = CONCAT62(auVar87._9_6_,CONCAT11(cVar8,bVar3));
      auVar280._7_8_ = 0;
      auVar280._0_7_ = (uint7)((ulong)uVar288 >> 8);
      Var188 = CONCAT81(SUB158(auVar280 << 0x40,7),cVar7);
      auVar318._9_6_ = 0;
      auVar318._0_9_ = Var188;
      auVar281._1_10_ = SUB1510(auVar318 << 0x30,5);
      auVar281[0] = cVar6;
      auVar319._11_4_ = 0;
      auVar319._0_11_ = auVar281;
      auVar282._1_12_ = SUB1512(auVar319 << 0x20,3);
      auVar282[0] = cVar5;
      sVar425 = (short)((ulong)uVar288 >> 8);
      sVar431 = (short)((ulong)uVar297 >> 0x18);
      sVar437 = (short)((ulong)uVar328 >> 0x28);
      uVar389 = (ushort)Var188;
      uVar380 = auVar281._0_2_;
      uVar376 = auVar282._0_2_;
      puVar2 = Y + lVar353 + (ulong)Y_stride + 0x10;
      *puVar2 = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
      puVar2[1] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
      puVar2[2] = (uVar376 != 0) * (uVar376 < 0x100) * cVar5 - (0xff < uVar376);
      puVar2[3] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      puVar2[4] = (uVar380 != 0) * (uVar380 < 0x100) * cVar6 - (0xff < uVar380);
      puVar2[5] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[6] = (uVar389 != 0) * (uVar389 < 0x100) * cVar7 - (0xff < uVar389);
      puVar2[7] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
      puVar2[8] = (0 < sVar425) * (sVar425 < 0x100) * cVar8 - (0xff < sVar425);
      puVar2[9] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
      puVar2[10] = (0 < sVar431) * (sVar431 < 0x100) * cVar9 - (0xff < sVar431);
      puVar2[0xb] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      puVar2[0xc] = (0 < sVar437) * (sVar437 < 0x100) * cVar4 - (0xff < sVar437);
      puVar2[0xd] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
      puVar2[0xe] = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
      puVar2[0xf] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
      auVar390 = psraw(auVar449,2);
      auVar391 = pshuflw(ZEXT116(bVar10),ZEXT116(bVar10),0);
      sVar425 = auVar391._0_2_;
      auVar450._0_2_ = auVar390._0_2_ * sVar425;
      sVar431 = auVar391._2_2_;
      auVar450._2_2_ = auVar390._2_2_ * sVar431;
      auVar450._4_2_ = auVar390._4_2_ * sVar425;
      auVar450._6_2_ = auVar390._6_2_ * sVar431;
      auVar450._8_2_ = auVar390._8_2_ * sVar425;
      auVar450._10_2_ = auVar390._10_2_ * sVar431;
      auVar450._12_2_ = auVar390._12_2_ * sVar425;
      auVar450._14_2_ = auVar390._14_2_ * sVar431;
      auVar391 = psraw(auVar514,2);
      auVar515._0_2_ = auVar391._0_2_ * sVar425;
      auVar515._2_2_ = auVar391._2_2_ * sVar431;
      auVar515._4_2_ = auVar391._4_2_ * sVar425;
      auVar515._6_2_ = auVar391._6_2_ * sVar431;
      auVar515._8_2_ = auVar391._8_2_ * sVar425;
      auVar515._10_2_ = auVar391._10_2_ * sVar431;
      auVar515._12_2_ = auVar391._12_2_ * sVar425;
      auVar515._14_2_ = auVar391._14_2_ * sVar431;
      auVar391 = psraw(auVar450,8);
      sVar398 = auVar391._0_2_ + 0x80;
      sVar400 = auVar391._2_2_ + 0x80;
      sVar402 = auVar391._4_2_ + 0x80;
      sVar404 = auVar391._6_2_ + 0x80;
      sVar471 = auVar391._8_2_ + 0x80;
      sVar477 = auVar391._10_2_ + 0x80;
      sVar473 = auVar391._12_2_ + 0x80;
      sVar479 = auVar391._14_2_ + 0x80;
      auVar391._2_2_ =
           (auVar201._0_2_ + auVar190._0_2_ + (ushort)bVar100 + (ushort)bVar97) - sVar428;
      auVar391._0_2_ =
           ((ushort)bVar377 + (ushort)auVar516[0] + (auVar486._14_2_ & 0xff) + (ushort)bVar94) -
           sVar414;
      auVar391._4_2_ =
           (auVar200._0_2_ + auVar189._0_2_ + (ushort)bVar106 + (ushort)bVar103) - sVar434;
      auVar391._6_2_ = (sVar494 + sVar521 + (ushort)bVar111 + (ushort)bVar109) - sVar441;
      auVar391._8_2_ = (sVar495 + auVar88._8_2_ + (ushort)bVar116 + (ushort)bVar114) - sVar451;
      auVar391._10_2_ =
           (sVar505 + auVar66._10_2_ + (auVar388._14_2_ & 0xff) + (ushort)bVar119) - sVar460;
      auVar391._12_2_ =
           (sVar517 + auVar44._12_2_ + (ushort)bVar125 + (auVar512._14_2_ & 0xff)) - sVar461;
      auVar391._14_2_ =
           (uVar90 + (uVar43 >> 8) + (ushort)bVar128 + (auVar512._14_2_ >> 8)) - sVar462;
      auVar391 = psraw(auVar391,2);
      auVar516 = psraw(auVar515,8);
      sVar505 = auVar516._0_2_ + 0x80;
      sVar517 = auVar516._2_2_ + 0x80;
      sVar416 = auVar516._4_2_ + 0x80;
      sVar463 = auVar516._6_2_ + 0x80;
      sVar464 = auVar516._8_2_ + 0x80;
      sVar521 = auVar516._10_2_ + 0x80;
      sVar465 = auVar516._12_2_ + 0x80;
      sVar466 = auVar516._14_2_ + 0x80;
      auVar516 = pshuflw(ZEXT116(bVar11),ZEXT116(bVar11),0);
      sVar414 = auVar516._0_2_;
      auVar393._0_2_ = auVar391._0_2_ * sVar414;
      sVar425 = auVar516._2_2_;
      auVar393._2_2_ = auVar391._2_2_ * sVar425;
      auVar393._4_2_ = auVar391._4_2_ * sVar414;
      auVar393._6_2_ = auVar391._6_2_ * sVar425;
      auVar393._8_2_ = auVar391._8_2_ * sVar414;
      auVar393._10_2_ = auVar391._10_2_ * sVar425;
      auVar393._12_2_ = auVar391._12_2_ * sVar414;
      auVar393._14_2_ = auVar391._14_2_ * sVar425;
      auVar516 = psraw(auVar488,2);
      auVar489._0_2_ = auVar516._0_2_ * sVar414;
      auVar489._2_2_ = auVar516._2_2_ * sVar425;
      auVar489._4_2_ = auVar516._4_2_ * sVar414;
      auVar489._6_2_ = auVar516._6_2_ * sVar425;
      auVar489._8_2_ = auVar516._8_2_ * sVar414;
      auVar489._10_2_ = auVar516._10_2_ * sVar425;
      auVar489._12_2_ = auVar516._12_2_ * sVar414;
      auVar489._14_2_ = auVar516._14_2_ * sVar425;
      auVar516 = psraw(auVar393,8);
      sVar414 = auVar516._0_2_ + 0x80;
      sVar425 = auVar516._2_2_ + 0x80;
      sVar428 = auVar516._4_2_ + 0x80;
      sVar431 = auVar516._6_2_ + 0x80;
      sVar434 = auVar516._8_2_ + 0x80;
      sVar437 = auVar516._10_2_ + 0x80;
      sVar441 = auVar516._12_2_ + 0x80;
      sVar445 = auVar516._14_2_ + 0x80;
      auVar516 = psraw(auVar489,8);
      sVar451 = auVar516._0_2_ + 0x80;
      sVar460 = auVar516._2_2_ + 0x80;
      sVar461 = auVar516._4_2_ + 0x80;
      sVar462 = auVar516._6_2_ + 0x80;
      sVar474 = auVar516._8_2_ + 0x80;
      sVar475 = auVar516._10_2_ + 0x80;
      sVar494 = auVar516._12_2_ + 0x80;
      sVar495 = auVar516._14_2_ + 0x80;
      puVar2 = U + uVar351;
      *puVar2 = (0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 - (0xff < sVar398);
      puVar2[1] = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
      puVar2[2] = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
      puVar2[3] = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
      puVar2[4] = (0 < sVar471) * (sVar471 < 0x100) * (char)sVar471 - (0xff < sVar471);
      puVar2[5] = (0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 - (0xff < sVar477);
      puVar2[6] = (0 < sVar473) * (sVar473 < 0x100) * (char)sVar473 - (0xff < sVar473);
      puVar2[7] = (0 < sVar479) * (sVar479 < 0x100) * (char)sVar479 - (0xff < sVar479);
      puVar2[8] = (0 < sVar505) * (sVar505 < 0x100) * (char)sVar505 - (0xff < sVar505);
      puVar2[9] = (0 < sVar517) * (sVar517 < 0x100) * (char)sVar517 - (0xff < sVar517);
      puVar2[10] = (0 < sVar416) * (sVar416 < 0x100) * (char)sVar416 - (0xff < sVar416);
      puVar2[0xb] = (0 < sVar463) * (sVar463 < 0x100) * (char)sVar463 - (0xff < sVar463);
      puVar2[0xc] = (0 < sVar464) * (sVar464 < 0x100) * (char)sVar464 - (0xff < sVar464);
      puVar2[0xd] = (0 < sVar521) * (sVar521 < 0x100) * (char)sVar521 - (0xff < sVar521);
      puVar2[0xe] = (0 < sVar465) * (sVar465 < 0x100) * (char)sVar465 - (0xff < sVar465);
      puVar2[0xf] = (0 < sVar466) * (sVar466 < 0x100) * (char)sVar466 - (0xff < sVar466);
      puVar2 = V + uVar351;
      *puVar2 = (0 < sVar414) * (sVar414 < 0x100) * (char)sVar414 - (0xff < sVar414);
      puVar2[1] = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      puVar2[2] = (0 < sVar428) * (sVar428 < 0x100) * (char)sVar428 - (0xff < sVar428);
      puVar2[3] = (0 < sVar431) * (sVar431 < 0x100) * (char)sVar431 - (0xff < sVar431);
      puVar2[4] = (0 < sVar434) * (sVar434 < 0x100) * (char)sVar434 - (0xff < sVar434);
      puVar2[5] = (0 < sVar437) * (sVar437 < 0x100) * (char)sVar437 - (0xff < sVar437);
      puVar2[6] = (0 < sVar441) * (sVar441 < 0x100) * (char)sVar441 - (0xff < sVar441);
      puVar2[7] = (0 < sVar445) * (sVar445 < 0x100) * (char)sVar445 - (0xff < sVar445);
      puVar2[8] = (0 < sVar451) * (sVar451 < 0x100) * (char)sVar451 - (0xff < sVar451);
      puVar2[9] = (0 < sVar460) * (sVar460 < 0x100) * (char)sVar460 - (0xff < sVar460);
      puVar2[10] = (0 < sVar461) * (sVar461 < 0x100) * (char)sVar461 - (0xff < sVar461);
      puVar2[0xb] = (0 < sVar462) * (sVar462 < 0x100) * (char)sVar462 - (0xff < sVar462);
      puVar2[0xc] = (0 < sVar474) * (sVar474 < 0x100) * (char)sVar474 - (0xff < sVar474);
      puVar2[0xd] = (0 < sVar475) * (sVar475 < 0x100) * (char)sVar475 - (0xff < sVar475);
      puVar2[0xe] = (0 < sVar494) * (sVar494 < 0x100) * (char)sVar494 - (0xff < sVar494);
      puVar2[0xf] = (0 < sVar495) * (sVar495 < 0x100) * (char)sVar495 - (0xff < sVar495);
      uVar351 = uVar351 + 0x10;
      puVar352 = puVar352 + 0x60;
    }
    Y_stride = Y_stride + iVar34;
    uVar354 = (ulong)(uint)((int)uVar354 + iVar34);
    RGB_stride = RGB_stride + iVar21;
    uVar356 = uVar356 + iVar21;
  }
  return;
}

Assistant:

void rgb24_yuv420_sseu(uint32_t width, uint32_t height, 
	const uint8_t *RGB, uint32_t RGB_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			RGB2YUV_32
			
			rgb_ptr1+=96;
			rgb_ptr2+=96;
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}